

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  int iVar9;
  RTCFilterFunctionN p_Var10;
  code *pcVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  long lVar72;
  undefined1 auVar73 [32];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [28];
  byte bVar81;
  ulong uVar82;
  ulong uVar83;
  uint uVar84;
  ulong uVar85;
  Geometry *pGVar86;
  long lVar87;
  bool bVar88;
  ulong uVar89;
  undefined4 uVar90;
  undefined8 uVar91;
  float fVar105;
  vint4 bi_2;
  undefined1 auVar92 [16];
  float fVar104;
  float fVar106;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar96 [16];
  undefined1 auVar103 [32];
  float fVar110;
  float fVar124;
  vint4 bi_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [64];
  vint4 ai;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [64];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [64];
  float fVar173;
  float fVar174;
  vint4 ai_1;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar175;
  undefined1 auVar171 [32];
  undefined1 auVar172 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar182;
  float fVar183;
  undefined1 auVar181 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar201 [32];
  undefined4 uVar187;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar194 [64];
  undefined1 auVar199 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [64];
  RTCFilterFunctionNArguments args;
  int local_794;
  Primitive *local_790;
  Precalculations *local_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 local_744;
  ulong local_740;
  undefined1 auStack_738 [24];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  ulong local_648;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined8 local_530;
  undefined4 local_528;
  float local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  uint local_514;
  uint local_510;
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_470 [8];
  float fStack_468;
  float fStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar176 [16];
  undefined1 auVar200 [16];
  
  local_788 = pre;
  PVar8 = prim[1];
  uVar82 = (ulong)(byte)PVar8;
  lVar72 = uVar82 * 0x19;
  fVar125 = *(float *)(prim + lVar72 + 0x12);
  auVar17 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar72 + 6));
  auVar92._0_4_ = fVar125 * auVar17._0_4_;
  auVar92._4_4_ = fVar125 * auVar17._4_4_;
  auVar92._8_4_ = fVar125 * auVar17._8_4_;
  auVar92._12_4_ = fVar125 * auVar17._12_4_;
  auVar148._0_4_ = fVar125 * (ray->dir).field_0.m128[0];
  auVar148._4_4_ = fVar125 * (ray->dir).field_0.m128[1];
  auVar148._8_4_ = fVar125 * (ray->dir).field_0.m128[2];
  auVar148._12_4_ = fVar125 * (ray->dir).field_0.m128[3];
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar82 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar89 = (ulong)(uint)((int)(uVar82 * 9) * 2);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar82 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar89 = (ulong)(uint)((int)(uVar82 * 5) << 2);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar199._4_4_ = auVar148._0_4_;
  auVar199._0_4_ = auVar148._0_4_;
  auVar199._8_4_ = auVar148._0_4_;
  auVar199._12_4_ = auVar148._0_4_;
  auVar112 = vshufps_avx(auVar148,auVar148,0x55);
  auVar93 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar125 = auVar93._0_4_;
  auVar188._0_4_ = fVar125 * auVar13._0_4_;
  fVar104 = auVar93._4_4_;
  auVar188._4_4_ = fVar104 * auVar13._4_4_;
  fVar105 = auVar93._8_4_;
  auVar188._8_4_ = fVar105 * auVar13._8_4_;
  fVar106 = auVar93._12_4_;
  auVar188._12_4_ = fVar106 * auVar13._12_4_;
  auVar184._0_4_ = auVar16._0_4_ * fVar125;
  auVar184._4_4_ = auVar16._4_4_ * fVar104;
  auVar184._8_4_ = auVar16._8_4_ * fVar105;
  auVar184._12_4_ = auVar16._12_4_ * fVar106;
  auVar168._0_4_ = auVar126._0_4_ * fVar125;
  auVar168._4_4_ = auVar126._4_4_ * fVar104;
  auVar168._8_4_ = auVar126._8_4_ * fVar105;
  auVar168._12_4_ = auVar126._12_4_ * fVar106;
  auVar93 = vfmadd231ps_fma(auVar188,auVar112,auVar12);
  auVar113 = vfmadd231ps_fma(auVar184,auVar112,auVar15);
  auVar112 = vfmadd231ps_fma(auVar168,auVar94,auVar112);
  auVar136 = vfmadd231ps_fma(auVar93,auVar199,auVar17);
  auVar113 = vfmadd231ps_fma(auVar113,auVar199,auVar14);
  auVar186 = ZEXT1664(auVar113);
  auVar144 = vfmadd231ps_fma(auVar112,auVar95,auVar199);
  auVar200._4_4_ = auVar92._0_4_;
  auVar200._0_4_ = auVar92._0_4_;
  auVar200._8_4_ = auVar92._0_4_;
  auVar200._12_4_ = auVar92._0_4_;
  auVar203 = ZEXT1664(auVar200);
  auVar112 = vshufps_avx(auVar92,auVar92,0x55);
  auVar93 = vshufps_avx(auVar92,auVar92,0xaa);
  fVar125 = auVar93._0_4_;
  auVar149._0_4_ = fVar125 * auVar13._0_4_;
  fVar104 = auVar93._4_4_;
  auVar149._4_4_ = fVar104 * auVar13._4_4_;
  fVar105 = auVar93._8_4_;
  auVar149._8_4_ = fVar105 * auVar13._8_4_;
  fVar106 = auVar93._12_4_;
  auVar149._12_4_ = fVar106 * auVar13._12_4_;
  auVar111._0_4_ = auVar16._0_4_ * fVar125;
  auVar111._4_4_ = auVar16._4_4_ * fVar104;
  auVar111._8_4_ = auVar16._8_4_ * fVar105;
  auVar111._12_4_ = auVar16._12_4_ * fVar106;
  auVar93._0_4_ = auVar126._0_4_ * fVar125;
  auVar93._4_4_ = auVar126._4_4_ * fVar104;
  auVar93._8_4_ = auVar126._8_4_ * fVar105;
  auVar93._12_4_ = auVar126._12_4_ * fVar106;
  auVar12 = vfmadd231ps_fma(auVar149,auVar112,auVar12);
  auVar13 = vfmadd231ps_fma(auVar111,auVar112,auVar15);
  auVar15 = vfmadd231ps_fma(auVar93,auVar112,auVar94);
  auVar16 = vfmadd231ps_fma(auVar12,auVar200,auVar17);
  auVar94 = vfmadd231ps_fma(auVar13,auVar200,auVar14);
  auVar126 = vfmadd231ps_fma(auVar15,auVar200,auVar95);
  local_250._8_4_ = 0x7fffffff;
  local_250._0_8_ = 0x7fffffff7fffffff;
  local_250._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx(auVar136,local_250);
  auVar143._8_4_ = 0x219392ef;
  auVar143._0_8_ = 0x219392ef219392ef;
  auVar143._12_4_ = 0x219392ef;
  auVar17 = vcmpps_avx(auVar17,auVar143,1);
  auVar12 = vblendvps_avx(auVar136,auVar143,auVar17);
  auVar17 = vandps_avx(auVar113,local_250);
  auVar17 = vcmpps_avx(auVar17,auVar143,1);
  auVar13 = vblendvps_avx(auVar113,auVar143,auVar17);
  auVar17 = vandps_avx(auVar144,local_250);
  auVar17 = vcmpps_avx(auVar17,auVar143,1);
  auVar17 = vblendvps_avx(auVar144,auVar143,auVar17);
  auVar14 = vrcpps_avx(auVar12);
  auVar165._8_4_ = 0x3f800000;
  auVar165._0_8_ = 0x3f8000003f800000;
  auVar165._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar165);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar165);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar17);
  auVar17 = vfnmadd213ps_fma(auVar17,auVar12,auVar165);
  auVar95 = vfmadd132ps_fma(auVar17,auVar12,auVar12);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar144._0_4_ = auVar14._0_4_ * auVar17._0_4_;
  auVar144._4_4_ = auVar14._4_4_ * auVar17._4_4_;
  auVar144._8_4_ = auVar14._8_4_ * auVar17._8_4_;
  auVar144._12_4_ = auVar14._12_4_ * auVar17._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar17 = vpmovsxwd_avx(auVar12);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar16);
  auVar150._0_4_ = auVar14._0_4_ * auVar17._0_4_;
  auVar150._4_4_ = auVar14._4_4_ * auVar17._4_4_;
  auVar150._8_4_ = auVar14._8_4_ * auVar17._8_4_;
  auVar150._12_4_ = auVar14._12_4_ * auVar17._12_4_;
  auVar113._1_3_ = 0;
  auVar113[0] = PVar8;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar82 * -2 + 6);
  auVar17 = vpmovsxwd_avx(auVar14);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar94);
  auVar169._0_4_ = auVar17._0_4_ * auVar15._0_4_;
  auVar169._4_4_ = auVar17._4_4_ * auVar15._4_4_;
  auVar169._8_4_ = auVar17._8_4_ * auVar15._8_4_;
  auVar169._12_4_ = auVar17._12_4_ * auVar15._12_4_;
  auVar17 = vcvtdq2ps_avx(auVar12);
  auVar17 = vsubps_avx(auVar17,auVar94);
  auVar112._0_4_ = auVar15._0_4_ * auVar17._0_4_;
  auVar112._4_4_ = auVar15._4_4_ * auVar17._4_4_;
  auVar112._8_4_ = auVar15._8_4_ * auVar17._8_4_;
  auVar112._12_4_ = auVar15._12_4_ * auVar17._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar89 + uVar82 + 6);
  auVar17 = vpmovsxwd_avx(auVar15);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar126);
  auVar136._0_4_ = auVar95._0_4_ * auVar17._0_4_;
  auVar136._4_4_ = auVar95._4_4_ * auVar17._4_4_;
  auVar136._8_4_ = auVar95._8_4_ * auVar17._8_4_;
  auVar136._12_4_ = auVar95._12_4_ * auVar17._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar17 = vpmovsxwd_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar17 = vsubps_avx(auVar17,auVar126);
  auVar94._0_4_ = auVar95._0_4_ * auVar17._0_4_;
  auVar94._4_4_ = auVar95._4_4_ * auVar17._4_4_;
  auVar94._8_4_ = auVar95._8_4_ * auVar17._8_4_;
  auVar94._12_4_ = auVar95._12_4_ * auVar17._12_4_;
  auVar17 = vpminsd_avx(auVar144,auVar150);
  auVar12 = vpminsd_avx(auVar169,auVar112);
  auVar17 = vmaxps_avx(auVar17,auVar12);
  auVar12 = vpminsd_avx(auVar136,auVar94);
  uVar90 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar176._4_4_ = uVar90;
  auVar176._0_4_ = uVar90;
  auVar176._8_4_ = uVar90;
  auVar176._12_4_ = uVar90;
  auVar181 = ZEXT1664(auVar176);
  auVar12 = vmaxps_avx(auVar12,auVar176);
  auVar17 = vmaxps_avx(auVar17,auVar12);
  local_260._0_4_ = auVar17._0_4_ * 0.99999964;
  local_260._4_4_ = auVar17._4_4_ * 0.99999964;
  local_260._8_4_ = auVar17._8_4_ * 0.99999964;
  local_260._12_4_ = auVar17._12_4_ * 0.99999964;
  auVar17 = vpmaxsd_avx(auVar144,auVar150);
  auVar12 = vpmaxsd_avx(auVar169,auVar112);
  auVar17 = vminps_avx(auVar17,auVar12);
  auVar12 = vpmaxsd_avx(auVar136,auVar94);
  fVar125 = ray->tfar;
  auVar126._4_4_ = fVar125;
  auVar126._0_4_ = fVar125;
  auVar126._8_4_ = fVar125;
  auVar126._12_4_ = fVar125;
  auVar12 = vminps_avx(auVar12,auVar126);
  auVar17 = vminps_avx(auVar17,auVar12);
  auVar95._0_4_ = auVar17._0_4_ * 1.0000004;
  auVar95._4_4_ = auVar17._4_4_ * 1.0000004;
  auVar95._8_4_ = auVar17._8_4_ * 1.0000004;
  auVar95._12_4_ = auVar17._12_4_ * 1.0000004;
  auVar113[4] = PVar8;
  auVar113._5_3_ = 0;
  auVar113[8] = PVar8;
  auVar113._9_3_ = 0;
  auVar113[0xc] = PVar8;
  auVar113._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar113,_DAT_01f7fcf0);
  auVar17 = vcmpps_avx(local_260,auVar95,2);
  auVar17 = vandps_avx(auVar17,auVar12);
  uVar84 = vmovmskps_avx(auVar17);
  if (uVar84 == 0) {
    bVar88 = false;
  }
  else {
    uVar84 = uVar84 & 0xff;
    local_460 = mm_lookupmask_ps._16_8_;
    uStack_458 = mm_lookupmask_ps._24_8_;
    uStack_450 = mm_lookupmask_ps._16_8_;
    uStack_448 = mm_lookupmask_ps._24_8_;
    local_790 = prim;
    do {
      local_6a0 = auVar186._0_32_;
      local_6c0 = auVar181._0_32_;
      local_4e0 = auVar203._0_32_;
      lVar22 = 0;
      uVar89 = (ulong)uVar84;
      for (uVar82 = uVar89; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
        lVar22 = lVar22 + 1;
      }
      uVar89 = uVar89 - 1 & uVar89;
      local_744 = *(undefined4 *)(local_790 + lVar22 * 4 + 6);
      uVar82 = (ulong)(uint)((int)lVar22 << 6);
      local_648 = (ulong)*(uint *)(local_790 + 2);
      pGVar86 = (context->scene->geometries).items[*(uint *)(local_790 + 2)].ptr;
      pPVar1 = prim + uVar82 + lVar72 + 0x16;
      local_600 = *(undefined8 *)pPVar1;
      uStack_5f8 = *(undefined8 *)(pPVar1 + 8);
      if (uVar89 != 0) {
        uVar85 = uVar89 - 1 & uVar89;
        for (uVar83 = uVar89; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
        }
        if (uVar85 != 0) {
          for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_540 = *(undefined1 (*) [16])(prim + uVar82 + lVar72 + 0x26);
      auVar93 = local_540;
      local_550 = *(undefined1 (*) [16])(prim + uVar82 + lVar72 + 0x36);
      _local_470 = *(undefined1 (*) [16])(prim + uVar82 + lVar72 + 0x46);
      iVar9 = (int)pGVar86[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar4 = (ray->org).field_0;
      auVar12 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar4);
      uVar90 = auVar12._0_4_;
      auVar137._4_4_ = uVar90;
      auVar137._0_4_ = uVar90;
      auVar137._8_4_ = uVar90;
      auVar137._12_4_ = uVar90;
      auVar17 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      aVar5 = (pre->ray_space).vx.field_0;
      aVar6 = (pre->ray_space).vy.field_0;
      fVar125 = (pre->ray_space).vz.field_0.m128[0];
      fVar104 = (pre->ray_space).vz.field_0.m128[1];
      fVar105 = (pre->ray_space).vz.field_0.m128[2];
      fVar106 = (pre->ray_space).vz.field_0.m128[3];
      auVar151._0_4_ = auVar12._0_4_ * fVar125;
      auVar151._4_4_ = auVar12._4_4_ * fVar104;
      auVar151._8_4_ = auVar12._8_4_ * fVar105;
      auVar151._12_4_ = auVar12._12_4_ * fVar106;
      auVar17 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar6,auVar17);
      auVar16 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar137);
      auVar17 = vblendps_avx(auVar16,*(undefined1 (*) [16])pPVar1,8);
      auVar13 = vsubps_avx(local_540,(undefined1  [16])aVar4);
      uVar90 = auVar13._0_4_;
      auVar152._4_4_ = uVar90;
      auVar152._0_4_ = uVar90;
      auVar152._8_4_ = uVar90;
      auVar152._12_4_ = uVar90;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
      auVar177._0_4_ = auVar13._0_4_ * fVar125;
      auVar177._4_4_ = auVar13._4_4_ * fVar104;
      auVar177._8_4_ = auVar13._8_4_ * fVar105;
      auVar177._12_4_ = auVar13._12_4_ * fVar106;
      auVar12 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar6,auVar12);
      auVar95 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar152);
      auVar12 = vblendps_avx(auVar95,local_540,8);
      auVar112 = local_550;
      auVar14 = vsubps_avx(local_550,(undefined1  [16])aVar4);
      uVar90 = auVar14._0_4_;
      auVar159._4_4_ = uVar90;
      auVar159._0_4_ = uVar90;
      auVar159._8_4_ = uVar90;
      auVar159._12_4_ = uVar90;
      auVar13 = vshufps_avx(auVar14,auVar14,0x55);
      auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
      auVar189._0_4_ = auVar14._0_4_ * fVar125;
      auVar189._4_4_ = auVar14._4_4_ * fVar104;
      auVar189._8_4_ = auVar14._8_4_ * fVar105;
      auVar189._12_4_ = auVar14._12_4_ * fVar106;
      auVar13 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar6,auVar13);
      auVar94 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar159);
      auVar13 = vblendps_avx(auVar94,local_550,8);
      local_4c0._0_16_ = (undefined1  [16])aVar4;
      auVar15 = vsubps_avx(_local_470,(undefined1  [16])aVar4);
      uVar90 = auVar15._0_4_;
      auVar166._4_4_ = uVar90;
      auVar166._0_4_ = uVar90;
      auVar166._8_4_ = uVar90;
      auVar166._12_4_ = uVar90;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar127._0_4_ = auVar15._0_4_ * fVar125;
      auVar127._4_4_ = auVar15._4_4_ * fVar104;
      auVar127._8_4_ = auVar15._8_4_ * fVar105;
      auVar127._12_4_ = auVar15._12_4_ * fVar106;
      auVar14 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar6,auVar14);
      auVar126 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar5,auVar166);
      auVar14 = vblendps_avx(auVar126,_local_470,8);
      auVar17 = vandps_avx(auVar17,local_250);
      auVar12 = vandps_avx(auVar12,local_250);
      auVar15 = vmaxps_avx(auVar17,auVar12);
      auVar17 = vandps_avx(auVar13,local_250);
      auVar12 = vandps_avx(auVar14,local_250);
      auVar17 = vmaxps_avx(auVar17,auVar12);
      auVar17 = vmaxps_avx(auVar15,auVar17);
      auVar12 = vmovshdup_avx(auVar17);
      auVar12 = vmaxss_avx(auVar12,auVar17);
      auVar17 = vshufpd_avx(auVar17,auVar17,1);
      auVar17 = vmaxss_avx(auVar17,auVar12);
      lVar22 = (long)iVar9 * 0x44;
      auVar12 = vmovshdup_avx(auVar16);
      uVar91 = auVar12._0_8_;
      local_3e0._8_8_ = uVar91;
      local_3e0._0_8_ = uVar91;
      local_3e0._16_8_ = uVar91;
      local_3e0._24_8_ = uVar91;
      auVar12 = vmovshdup_avx(auVar95);
      uVar91 = auVar12._0_8_;
      local_2a0._8_8_ = uVar91;
      local_2a0._0_8_ = uVar91;
      local_2a0._16_8_ = uVar91;
      local_2a0._24_8_ = uVar91;
      local_320 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x908);
      uVar187 = auVar94._0_4_;
      local_680._4_4_ = uVar187;
      local_680._0_4_ = uVar187;
      local_680._8_4_ = uVar187;
      local_680._12_4_ = uVar187;
      local_680._16_4_ = uVar187;
      local_680._20_4_ = uVar187;
      local_680._24_4_ = uVar187;
      local_680._28_4_ = uVar187;
      auVar12 = vmovshdup_avx(auVar94);
      uVar91 = auVar12._0_8_;
      local_5a0._8_8_ = uVar91;
      local_5a0._0_8_ = uVar91;
      local_5a0._16_8_ = uVar91;
      local_5a0._24_8_ = uVar91;
      fVar125 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar80 = *(undefined1 (*) [28])(bezier_basis0 + lVar22 + 0xd8c);
      auVar12 = vmovshdup_avx(auVar126);
      local_580 = auVar12._0_8_;
      local_620 = auVar126._0_4_;
      auVar114._0_4_ = local_620 * fVar125;
      auVar114._4_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar114._8_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar114._12_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar114._16_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar114._20_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar114._24_4_ = local_620 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar114._28_4_ = 0;
      auVar13 = vfmadd231ps_fma(auVar114,local_320,local_680);
      fVar173 = auVar12._0_4_;
      auVar147._0_4_ = fVar173 * fVar125;
      fVar174 = auVar12._4_4_;
      auVar147._4_4_ = fVar174 * *(float *)(bezier_basis0 + lVar22 + 0xd90);
      auVar147._8_4_ = fVar173 * *(float *)(bezier_basis0 + lVar22 + 0xd94);
      auVar147._12_4_ = fVar174 * *(float *)(bezier_basis0 + lVar22 + 0xd98);
      auVar147._16_4_ = fVar173 * *(float *)(bezier_basis0 + lVar22 + 0xd9c);
      auVar147._20_4_ = fVar174 * *(float *)(bezier_basis0 + lVar22 + 0xda0);
      auVar147._24_4_ = fVar173 * *(float *)(bezier_basis0 + lVar22 + 0xda4);
      auVar147._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar147,local_320,local_5a0);
      auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x484);
      uVar90 = auVar95._0_4_;
      local_640._4_4_ = uVar90;
      local_640._0_4_ = uVar90;
      local_640._8_4_ = uVar90;
      local_640._12_4_ = uVar90;
      local_640._16_4_ = uVar90;
      local_640._20_4_ = uVar90;
      local_640._24_4_ = uVar90;
      local_640._28_4_ = uVar90;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar114,local_640);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar114,local_2a0);
      auVar147 = *(undefined1 (*) [32])(bezier_basis0 + lVar22);
      local_4a0._0_4_ = auVar16._0_4_;
      local_5c0._4_4_ = (float)local_4a0;
      local_5c0._0_4_ = (float)local_4a0;
      local_5c0._8_4_ = (float)local_4a0;
      local_5c0._12_4_ = (float)local_4a0;
      local_5c0._16_4_ = (float)local_4a0;
      local_5c0._20_4_ = (float)local_4a0;
      local_5c0._24_4_ = (float)local_4a0;
      local_5c0._28_4_ = (float)local_4a0;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar147,local_5c0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar147,local_3e0);
      auVar7 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x908);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0xd8c);
      auVar194 = ZEXT3264(auVar102);
      fStack_61c = local_620;
      fStack_618 = local_620;
      fStack_614 = local_620;
      fStack_610 = local_620;
      fStack_60c = local_620;
      fStack_608 = local_620;
      fStack_604 = local_620;
      fVar175 = auVar102._0_4_;
      fVar182 = auVar102._4_4_;
      auVar120._4_4_ = fVar182 * local_620;
      auVar120._0_4_ = fVar175 * local_620;
      fVar183 = auVar102._8_4_;
      auVar120._8_4_ = fVar183 * local_620;
      fVar195 = auVar102._12_4_;
      auVar120._12_4_ = fVar195 * local_620;
      fVar196 = auVar102._16_4_;
      auVar120._16_4_ = fVar196 * local_620;
      fVar197 = auVar102._20_4_;
      auVar120._20_4_ = fVar197 * local_620;
      fVar198 = auVar102._24_4_;
      auVar120._24_4_ = fVar198 * local_620;
      auVar120._28_4_ = local_620;
      auVar14 = vfmadd231ps_fma(auVar120,auVar7,local_680);
      uStack_578 = local_580;
      uStack_570 = local_580;
      uStack_568 = local_580;
      auVar102._4_4_ = fVar174 * fVar182;
      auVar102._0_4_ = fVar173 * fVar175;
      auVar102._8_4_ = fVar173 * fVar183;
      auVar102._12_4_ = fVar174 * fVar195;
      auVar102._16_4_ = fVar173 * fVar196;
      auVar102._20_4_ = fVar174 * fVar197;
      auVar102._24_4_ = fVar173 * fVar198;
      auVar102._28_4_ = uVar187;
      auVar15 = vfmadd231ps_fma(auVar102,auVar7,local_5a0);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x484);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar102,local_640);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar102,local_2a0);
      auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar22);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar120,local_5c0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar120,local_3e0);
      local_2c0 = ZEXT1632(auVar14);
      auVar115 = ZEXT1632(auVar13);
      auVar18 = vsubps_avx(local_2c0,auVar115);
      auVar158 = ZEXT3264(auVar18);
      _local_2e0 = ZEXT1632(auVar15);
      local_300 = ZEXT1632(auVar12);
      local_340 = vsubps_avx(_local_2e0,local_300);
      auVar97._0_4_ = auVar12._0_4_ * auVar18._0_4_;
      auVar97._4_4_ = auVar12._4_4_ * auVar18._4_4_;
      auVar97._8_4_ = auVar12._8_4_ * auVar18._8_4_;
      auVar97._12_4_ = auVar12._12_4_ * auVar18._12_4_;
      auVar97._16_4_ = auVar18._16_4_ * 0.0;
      auVar97._20_4_ = auVar18._20_4_ * 0.0;
      auVar97._24_4_ = auVar18._24_4_ * 0.0;
      auVar97._28_4_ = 0;
      fVar125 = local_340._0_4_;
      auVar116._0_4_ = auVar13._0_4_ * fVar125;
      fVar104 = local_340._4_4_;
      auVar116._4_4_ = auVar13._4_4_ * fVar104;
      fVar105 = local_340._8_4_;
      auVar116._8_4_ = auVar13._8_4_ * fVar105;
      fVar106 = local_340._12_4_;
      auVar116._12_4_ = auVar13._12_4_ * fVar106;
      fVar107 = local_340._16_4_;
      auVar116._16_4_ = fVar107 * 0.0;
      fVar108 = local_340._20_4_;
      auVar116._20_4_ = fVar108 * 0.0;
      fVar109 = local_340._24_4_;
      auVar116._24_4_ = fVar109 * 0.0;
      auVar116._28_4_ = 0;
      auVar97 = vsubps_avx(auVar97,auVar116);
      auVar12 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar91 = auVar12._0_8_;
      local_80._8_8_ = uVar91;
      local_80._0_8_ = uVar91;
      local_80._16_8_ = uVar91;
      local_80._24_8_ = uVar91;
      auVar13 = vpermilps_avx(local_540,0xff);
      uVar91 = auVar13._0_8_;
      local_a0._8_8_ = uVar91;
      local_a0._0_8_ = uVar91;
      local_a0._16_8_ = uVar91;
      local_a0._24_8_ = uVar91;
      auVar13 = vpermilps_avx(local_550,0xff);
      uVar91 = auVar13._0_8_;
      local_c0._8_8_ = uVar91;
      local_c0._0_8_ = uVar91;
      local_c0._16_8_ = uVar91;
      local_c0._24_8_ = uVar91;
      auVar13 = vpermilps_avx(_local_470,0xff);
      local_e0 = auVar13._0_8_;
      local_780._0_4_ = auVar80._0_4_;
      local_780._4_4_ = auVar80._4_4_;
      fStack_778 = auVar80._8_4_;
      fStack_774 = auVar80._12_4_;
      fStack_770 = auVar80._16_4_;
      fStack_76c = auVar80._20_4_;
      fStack_768 = auVar80._24_4_;
      fVar110 = auVar13._0_4_;
      fVar124 = auVar13._4_4_;
      auVar134._4_4_ = fVar124 * (float)local_780._4_4_;
      auVar134._0_4_ = fVar110 * (float)local_780._0_4_;
      auVar134._8_4_ = fVar110 * fStack_778;
      auVar134._12_4_ = fVar124 * fStack_774;
      auVar134._16_4_ = fVar110 * fStack_770;
      auVar134._20_4_ = fVar124 * fStack_76c;
      auVar134._24_4_ = fVar110 * fStack_768;
      auVar134._28_4_ = (float)local_4a0;
      auVar13 = vfmadd231ps_fma(auVar134,local_320,local_c0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar114,local_a0);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar147,local_80);
      uStack_d8 = local_e0;
      uStack_d0 = local_e0;
      uStack_c8 = local_e0;
      auVar21._4_4_ = fVar182 * fVar124;
      auVar21._0_4_ = fVar175 * fVar110;
      auVar21._8_4_ = fVar183 * fVar110;
      auVar21._12_4_ = fVar195 * fVar124;
      auVar21._16_4_ = fVar196 * fVar110;
      auVar21._20_4_ = fVar197 * fVar124;
      auVar21._24_4_ = fVar198 * fVar110;
      auVar21._28_4_ = auVar147._28_4_;
      auVar14 = vfmadd231ps_fma(auVar21,auVar7,local_c0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar102,local_a0);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar120,local_80);
      auVar103._4_4_ = fVar104 * fVar104;
      auVar103._0_4_ = fVar125 * fVar125;
      auVar103._8_4_ = fVar105 * fVar105;
      auVar103._12_4_ = fVar106 * fVar106;
      auVar103._16_4_ = fVar107 * fVar107;
      auVar103._20_4_ = fVar108 * fVar108;
      auVar103._24_4_ = fVar109 * fVar109;
      auVar103._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar103,auVar18,auVar18);
      auVar134 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
      auVar160._4_4_ = auVar134._4_4_ * auVar134._4_4_ * auVar12._4_4_;
      auVar160._0_4_ = auVar134._0_4_ * auVar134._0_4_ * auVar12._0_4_;
      auVar160._8_4_ = auVar134._8_4_ * auVar134._8_4_ * auVar12._8_4_;
      auVar160._12_4_ = auVar134._12_4_ * auVar134._12_4_ * auVar12._12_4_;
      auVar160._16_4_ = auVar134._16_4_ * auVar134._16_4_ * 0.0;
      auVar160._20_4_ = auVar134._20_4_ * auVar134._20_4_ * 0.0;
      auVar160._24_4_ = auVar134._24_4_ * auVar134._24_4_ * 0.0;
      auVar160._28_4_ = auVar134._28_4_;
      auVar19._4_4_ = auVar97._4_4_ * auVar97._4_4_;
      auVar19._0_4_ = auVar97._0_4_ * auVar97._0_4_;
      auVar19._8_4_ = auVar97._8_4_ * auVar97._8_4_;
      auVar19._12_4_ = auVar97._12_4_ * auVar97._12_4_;
      auVar19._16_4_ = auVar97._16_4_ * auVar97._16_4_;
      auVar19._20_4_ = auVar97._20_4_ * auVar97._20_4_;
      auVar19._24_4_ = auVar97._24_4_ * auVar97._24_4_;
      auVar19._28_4_ = auVar97._28_4_;
      auVar134 = vcmpps_avx(auVar19,auVar160,2);
      auVar98._0_4_ = (float)iVar9;
      fVar125 = auVar17._0_4_ * 4.7683716e-07;
      local_420 = (ulong)(uint)auVar98._0_4_;
      uStack_418 = 0;
      auVar98._4_4_ = auVar98._0_4_;
      auVar98._8_4_ = auVar98._0_4_;
      auVar98._12_4_ = auVar98._0_4_;
      auVar98._16_4_ = auVar98._0_4_;
      auVar98._20_4_ = auVar98._0_4_;
      auVar98._24_4_ = auVar98._0_4_;
      auVar98._28_4_ = auVar98._0_4_;
      auVar97 = vcmpps_avx(_DAT_01faff40,auVar98,1);
      auVar17 = vpermilps_avx(auVar16,0xaa);
      uVar91 = auVar17._0_8_;
      local_400._8_8_ = uVar91;
      local_400._0_8_ = uVar91;
      local_400._16_8_ = uVar91;
      local_400._24_8_ = uVar91;
      auVar12 = vpermilps_avx(auVar95,0xaa);
      uVar91 = auVar12._0_8_;
      local_280._8_8_ = uVar91;
      local_280._0_8_ = uVar91;
      local_280._16_8_ = uVar91;
      local_280._24_8_ = uVar91;
      auVar12 = vpermilps_avx(auVar94,0xaa);
      uVar91 = auVar12._0_8_;
      local_3c0._8_8_ = uVar91;
      local_3c0._0_8_ = uVar91;
      local_3c0._16_8_ = uVar91;
      local_3c0._24_8_ = uVar91;
      auVar12 = vpermilps_avx(auVar126,0xaa);
      uStack_498 = auVar12._0_8_;
      local_4a0 = uStack_498;
      auVar15 = _local_4a0;
      uStack_490 = uStack_498;
      uStack_488 = uStack_498;
      auVar21 = auVar97 & auVar134;
      local_720._0_16_ = ZEXT416((uint)fVar125);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        bVar88 = false;
LAB_015983a6:
        auVar203 = ZEXT3264(local_4e0);
        auVar181 = ZEXT3264(local_6c0);
        auVar186 = ZEXT3264(local_6a0);
        auVar191 = ZEXT3264(local_680);
LAB_01598973:
        auVar164 = ZEXT3264(local_5a0);
        auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                      CONCAT424(fStack_608,
                                                CONCAT420(fStack_60c,
                                                          CONCAT416(fStack_610,
                                                                    CONCAT412(fStack_614,
                                                                              CONCAT48(fStack_618,
                                                                                       CONCAT44(
                                                  fStack_61c,local_620))))))));
        auVar172 = ZEXT3264(local_640);
LAB_0159898e:
        auVar123 = ZEXT3264(local_6e0);
        auVar142 = ZEXT3264(local_5c0);
      }
      else {
        local_700 = vandps_avx(auVar134,auVar97);
        local_4a0._0_4_ = auVar12._0_4_;
        local_4a0._4_4_ = auVar12._4_4_;
        auVar20._4_4_ = fVar182 * local_4a0._4_4_;
        auVar20._0_4_ = fVar175 * (float)local_4a0;
        auVar20._8_4_ = fVar183 * (float)local_4a0;
        auVar20._12_4_ = fVar195 * local_4a0._4_4_;
        auVar20._16_4_ = fVar196 * (float)local_4a0;
        auVar20._20_4_ = fVar197 * local_4a0._4_4_;
        auVar20._24_4_ = fVar198 * (float)local_4a0;
        auVar20._28_4_ = local_700._28_4_;
        auVar12 = vfmadd213ps_fma(auVar7,local_3c0,auVar20);
        auVar12 = vfmadd213ps_fma(auVar102,local_280,ZEXT1632(auVar12));
        auVar12 = vfmadd213ps_fma(auVar120,local_400,ZEXT1632(auVar12));
        local_360 = ZEXT1632(auVar12);
        auVar7._4_4_ = local_4a0._4_4_ * (float)local_780._4_4_;
        auVar7._0_4_ = (float)local_4a0 * (float)local_780._0_4_;
        auVar7._8_4_ = (float)local_4a0 * fStack_778;
        auVar7._12_4_ = local_4a0._4_4_ * fStack_774;
        auVar7._16_4_ = (float)local_4a0 * fStack_770;
        auVar7._20_4_ = local_4a0._4_4_ * fStack_76c;
        auVar7._24_4_ = (float)local_4a0 * fStack_768;
        auVar7._28_4_ = local_700._28_4_;
        auVar12 = vfmadd213ps_fma(local_320,local_3c0,auVar7);
        auVar12 = vfmadd213ps_fma(auVar114,local_280,ZEXT1632(auVar12));
        auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1210);
        auVar7 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1694);
        auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar22 + 0x1b18);
        fVar104 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar105 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar106 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar107 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar108 = *(float *)(bezier_basis0 + lVar22 + 0x1fac);
        fVar109 = *(float *)(bezier_basis0 + lVar22 + 0x1fb0);
        fVar110 = *(float *)(bezier_basis0 + lVar22 + 0x1fb4);
        auVar201._4_4_ = local_620 * fVar105;
        auVar201._0_4_ = local_620 * fVar104;
        auVar201._8_4_ = local_620 * fVar106;
        auVar201._12_4_ = local_620 * fVar107;
        auVar201._16_4_ = local_620 * fVar108;
        auVar201._20_4_ = local_620 * fVar109;
        auVar201._24_4_ = local_620 * fVar110;
        auVar201._28_4_ = auVar18._28_4_;
        auVar170._0_4_ = fVar173 * fVar104;
        auVar170._4_4_ = fVar174 * fVar105;
        auVar170._8_4_ = fVar173 * fVar106;
        auVar170._12_4_ = fVar174 * fVar107;
        auVar170._16_4_ = fVar173 * fVar108;
        auVar170._20_4_ = fVar174 * fVar109;
        auVar170._24_4_ = fVar173 * fVar110;
        auVar170._28_4_ = 0;
        auVar185._0_4_ = fVar104 * (float)local_4a0;
        auVar185._4_4_ = fVar105 * local_4a0._4_4_;
        auVar185._8_4_ = fVar106 * (float)local_4a0;
        auVar185._12_4_ = fVar107 * local_4a0._4_4_;
        auVar185._16_4_ = fVar108 * (float)local_4a0;
        auVar185._20_4_ = fVar109 * local_4a0._4_4_;
        auVar185._24_4_ = fVar110 * (float)local_4a0;
        auVar185._28_4_ = 0;
        auVar16 = vfmadd231ps_fma(auVar201,auVar102,local_680);
        auVar95 = vfmadd231ps_fma(auVar170,auVar102,local_5a0);
        auVar94 = vfmadd231ps_fma(auVar185,local_3c0,auVar102);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,local_640);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar7,local_2a0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_280,auVar7);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar114,local_5c0);
        auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar114,local_3e0);
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_400,auVar114);
        fVar104 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar105 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar106 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar107 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        fVar108 = *(float *)(bezier_basis1 + lVar22 + 0x1fac);
        fVar109 = *(float *)(bezier_basis1 + lVar22 + 0x1fb0);
        fVar110 = *(float *)(bezier_basis1 + lVar22 + 0x1fb4);
        auVar161._4_4_ = local_620 * fVar105;
        auVar161._0_4_ = local_620 * fVar104;
        auVar161._8_4_ = local_620 * fVar106;
        auVar161._12_4_ = local_620 * fVar107;
        auVar161._16_4_ = local_620 * fVar108;
        auVar161._20_4_ = local_620 * fVar109;
        auVar161._24_4_ = local_620 * fVar110;
        auVar161._28_4_ = local_620;
        auVar23._4_4_ = fVar174 * fVar105;
        auVar23._0_4_ = fVar173 * fVar104;
        auVar23._8_4_ = fVar173 * fVar106;
        auVar23._12_4_ = fVar174 * fVar107;
        auVar23._16_4_ = fVar173 * fVar108;
        auVar23._20_4_ = fVar174 * fVar109;
        auVar23._24_4_ = fVar173 * fVar110;
        auVar23._28_4_ = fVar174;
        auVar24._4_4_ = fVar105 * local_4a0._4_4_;
        auVar24._0_4_ = fVar104 * (float)local_4a0;
        auVar24._8_4_ = fVar106 * (float)local_4a0;
        auVar24._12_4_ = fVar107 * local_4a0._4_4_;
        auVar24._16_4_ = fVar108 * (float)local_4a0;
        auVar24._20_4_ = fVar109 * local_4a0._4_4_;
        auVar24._24_4_ = fVar110 * (float)local_4a0;
        auVar24._28_4_ = auVar17._4_4_;
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1b18);
        auVar17 = vfmadd231ps_fma(auVar161,auVar114,local_680);
        auVar126 = vfmadd231ps_fma(auVar23,auVar114,local_5a0);
        auVar113 = vfmadd231ps_fma(auVar24,auVar114,local_3c0);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1694);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar114,local_640);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar114,local_2a0);
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_280,auVar114);
        auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar22 + 0x1210);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar114,local_5c0);
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar114,local_3e0);
        auVar117._8_4_ = 0x7fffffff;
        auVar117._0_8_ = 0x7fffffff7fffffff;
        auVar117._12_4_ = 0x7fffffff;
        auVar117._16_4_ = 0x7fffffff;
        auVar117._20_4_ = 0x7fffffff;
        auVar117._24_4_ = 0x7fffffff;
        auVar117._28_4_ = 0x7fffffff;
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),local_400,auVar114);
        auVar114 = vandps_avx(ZEXT1632(auVar16),auVar117);
        auVar7 = vandps_avx(ZEXT1632(auVar95),auVar117);
        auVar7 = vmaxps_avx(auVar114,auVar7);
        auVar114 = vandps_avx(ZEXT1632(auVar94),auVar117);
        auVar114 = vmaxps_avx(auVar7,auVar114);
        auVar132._4_4_ = fVar125;
        auVar132._0_4_ = fVar125;
        auVar132._8_4_ = fVar125;
        auVar132._12_4_ = fVar125;
        auVar132._16_4_ = fVar125;
        auVar132._20_4_ = fVar125;
        auVar132._24_4_ = fVar125;
        auVar132._28_4_ = fVar125;
        auVar114 = vcmpps_avx(auVar114,auVar132,1);
        auVar102 = vblendvps_avx(ZEXT1632(auVar16),auVar18,auVar114);
        auVar120 = vblendvps_avx(ZEXT1632(auVar95),local_340,auVar114);
        auVar114 = vandps_avx(ZEXT1632(auVar17),auVar117);
        auVar7 = vandps_avx(ZEXT1632(auVar126),auVar117);
        auVar134 = vmaxps_avx(auVar114,auVar7);
        auVar114 = vandps_avx(ZEXT1632(auVar113),auVar117);
        auVar114 = vmaxps_avx(auVar134,auVar114);
        auVar97 = vcmpps_avx(auVar114,auVar132,1);
        auVar114 = vblendvps_avx(ZEXT1632(auVar17),auVar18,auVar97);
        auVar134 = vblendvps_avx(ZEXT1632(auVar126),local_340,auVar97);
        auVar17 = vfmadd213ps_fma(auVar147,local_400,ZEXT1632(auVar12));
        auVar12 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,auVar120);
        auVar18 = vrsqrtps_avx(ZEXT1632(auVar12));
        fVar125 = auVar18._0_4_;
        fVar104 = auVar18._4_4_;
        fVar105 = auVar18._8_4_;
        fVar106 = auVar18._12_4_;
        fVar107 = auVar18._16_4_;
        fVar108 = auVar18._20_4_;
        fVar109 = auVar18._24_4_;
        auVar25._4_4_ = fVar104 * fVar104 * fVar104 * auVar12._4_4_ * -0.5;
        auVar25._0_4_ = fVar125 * fVar125 * fVar125 * auVar12._0_4_ * -0.5;
        auVar25._8_4_ = fVar105 * fVar105 * fVar105 * auVar12._8_4_ * -0.5;
        auVar25._12_4_ = fVar106 * fVar106 * fVar106 * auVar12._12_4_ * -0.5;
        auVar25._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar25._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar25._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar25._28_4_ = 0;
        auVar145._8_4_ = 0x3fc00000;
        auVar145._0_8_ = 0x3fc000003fc00000;
        auVar145._12_4_ = 0x3fc00000;
        auVar145._16_4_ = 0x3fc00000;
        auVar145._20_4_ = 0x3fc00000;
        auVar145._24_4_ = 0x3fc00000;
        auVar145._28_4_ = 0x3fc00000;
        auVar12 = vfmadd231ps_fma(auVar25,auVar145,auVar18);
        fVar125 = auVar12._0_4_;
        fVar104 = auVar12._4_4_;
        auVar26._4_4_ = auVar120._4_4_ * fVar104;
        auVar26._0_4_ = auVar120._0_4_ * fVar125;
        fVar105 = auVar12._8_4_;
        auVar26._8_4_ = auVar120._8_4_ * fVar105;
        fVar106 = auVar12._12_4_;
        auVar26._12_4_ = auVar120._12_4_ * fVar106;
        auVar26._16_4_ = auVar120._16_4_ * 0.0;
        auVar26._20_4_ = auVar120._20_4_ * 0.0;
        auVar26._24_4_ = auVar120._24_4_ * 0.0;
        auVar26._28_4_ = auVar18._28_4_;
        auVar18._4_4_ = -auVar102._4_4_ * fVar104;
        auVar18._0_4_ = -auVar102._0_4_ * fVar125;
        auVar18._8_4_ = -auVar102._8_4_ * fVar105;
        auVar18._12_4_ = -auVar102._12_4_ * fVar106;
        auVar18._16_4_ = -auVar102._16_4_ * 0.0;
        auVar18._20_4_ = -auVar102._20_4_ * 0.0;
        auVar18._24_4_ = -auVar102._24_4_ * 0.0;
        auVar18._28_4_ = auVar7._28_4_;
        auVar12 = vfmadd213ps_fma(auVar114,auVar114,ZEXT832(0) << 0x20);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar134,auVar134);
        auVar7 = vrsqrtps_avx(ZEXT1632(auVar12));
        auVar27._28_4_ = auVar97._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar104 * 0.0,fVar125 * 0.0))));
        fVar125 = auVar7._0_4_;
        fVar104 = auVar7._4_4_;
        fVar105 = auVar7._8_4_;
        fVar106 = auVar7._12_4_;
        fVar107 = auVar7._16_4_;
        fVar108 = auVar7._20_4_;
        fVar109 = auVar7._24_4_;
        auVar28._4_4_ = fVar104 * fVar104 * fVar104 * auVar12._4_4_ * -0.5;
        auVar28._0_4_ = fVar125 * fVar125 * fVar125 * auVar12._0_4_ * -0.5;
        auVar28._8_4_ = fVar105 * fVar105 * fVar105 * auVar12._8_4_ * -0.5;
        auVar28._12_4_ = fVar106 * fVar106 * fVar106 * auVar12._12_4_ * -0.5;
        auVar28._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
        auVar28._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
        auVar28._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar28._28_4_ = 0;
        auVar12 = vfmadd231ps_fma(auVar28,auVar145,auVar7);
        fVar125 = auVar12._0_4_;
        fVar104 = auVar12._4_4_;
        auVar29._4_4_ = auVar134._4_4_ * fVar104;
        auVar29._0_4_ = auVar134._0_4_ * fVar125;
        fVar105 = auVar12._8_4_;
        auVar29._8_4_ = auVar134._8_4_ * fVar105;
        fVar106 = auVar12._12_4_;
        auVar29._12_4_ = auVar134._12_4_ * fVar106;
        auVar29._16_4_ = auVar134._16_4_ * 0.0;
        auVar29._20_4_ = auVar134._20_4_ * 0.0;
        auVar29._24_4_ = auVar134._24_4_ * 0.0;
        auVar29._28_4_ = 0;
        auVar30._4_4_ = -auVar114._4_4_ * fVar104;
        auVar30._0_4_ = -auVar114._0_4_ * fVar125;
        auVar30._8_4_ = -auVar114._8_4_ * fVar105;
        auVar30._12_4_ = -auVar114._12_4_ * fVar106;
        auVar30._16_4_ = -auVar114._16_4_ * 0.0;
        auVar30._20_4_ = -auVar114._20_4_ * 0.0;
        auVar30._24_4_ = -auVar114._24_4_ * 0.0;
        auVar30._28_4_ = auVar134._28_4_;
        auVar31._28_4_ = auVar7._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar106 * 0.0,
                                CONCAT48(fVar105 * 0.0,CONCAT44(fVar104 * 0.0,fVar125 * 0.0))));
        auVar12 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar13),auVar115);
        auVar114 = ZEXT1632(auVar13);
        auVar16 = vfmadd213ps_fma(auVar18,auVar114,local_300);
        auVar95 = vfmadd213ps_fma(auVar27,auVar114,ZEXT1632(auVar17));
        auVar136 = vfnmadd213ps_fma(auVar26,auVar114,auVar115);
        auVar94 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar14),local_2c0);
        auVar144 = vfnmadd213ps_fma(auVar18,auVar114,local_300);
        auVar114 = ZEXT1632(auVar14);
        auVar126 = vfmadd213ps_fma(auVar30,auVar114,_local_2e0);
        auVar201 = ZEXT1632(auVar13);
        auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar201,auVar27);
        auVar113 = vfmadd213ps_fma(auVar31,auVar114,local_360);
        auVar92 = vfnmadd213ps_fma(auVar29,auVar114,local_2c0);
        auVar111 = vfnmadd213ps_fma(auVar30,auVar114,_local_2e0);
        local_440 = ZEXT1632(auVar14);
        auVar148 = vfnmadd231ps_fma(local_360,local_440,auVar31);
        auVar114 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar144));
        auVar7 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar143));
        auVar115._4_4_ = auVar143._4_4_ * auVar114._4_4_;
        auVar115._0_4_ = auVar143._0_4_ * auVar114._0_4_;
        auVar115._8_4_ = auVar143._8_4_ * auVar114._8_4_;
        auVar115._12_4_ = auVar143._12_4_ * auVar114._12_4_;
        auVar115._16_4_ = auVar114._16_4_ * 0.0;
        auVar115._20_4_ = auVar114._20_4_ * 0.0;
        auVar115._24_4_ = auVar114._24_4_ * 0.0;
        auVar115._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar115,ZEXT1632(auVar144),auVar7);
        auVar32._4_4_ = auVar136._4_4_ * auVar7._4_4_;
        auVar32._0_4_ = auVar136._0_4_ * auVar7._0_4_;
        auVar32._8_4_ = auVar136._8_4_ * auVar7._8_4_;
        auVar32._12_4_ = auVar136._12_4_ * auVar7._12_4_;
        auVar32._16_4_ = auVar7._16_4_ * 0.0;
        auVar32._20_4_ = auVar7._20_4_ * 0.0;
        auVar32._24_4_ = auVar7._24_4_ * 0.0;
        auVar32._28_4_ = auVar7._28_4_;
        auVar97 = ZEXT1632(auVar136);
        auVar7 = vsubps_avx(ZEXT1632(auVar94),auVar97);
        auVar17 = vfmsub231ps_fma(auVar32,ZEXT1632(auVar143),auVar7);
        auVar33._4_4_ = auVar144._4_4_ * auVar7._4_4_;
        auVar33._0_4_ = auVar144._0_4_ * auVar7._0_4_;
        auVar33._8_4_ = auVar144._8_4_ * auVar7._8_4_;
        auVar33._12_4_ = auVar144._12_4_ * auVar7._12_4_;
        auVar33._16_4_ = auVar7._16_4_ * 0.0;
        auVar33._20_4_ = auVar7._20_4_ * 0.0;
        auVar33._24_4_ = auVar7._24_4_ * 0.0;
        auVar33._28_4_ = auVar7._28_4_;
        auVar136 = vfmsub231ps_fma(auVar33,auVar97,auVar114);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar136),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
        auStack_4f0 = auVar147._16_16_;
        local_500 = local_700._16_16_;
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar103 = vcmpps_avx(ZEXT1632(auVar17),ZEXT832(0) << 0x20,2);
        auVar114 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar12),auVar103);
        auVar147 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar16),auVar103);
        auVar7 = vblendvps_avx(ZEXT1632(auVar148),ZEXT1632(auVar95),auVar103);
        auVar102 = vblendvps_avx(auVar97,ZEXT1632(auVar94),auVar103);
        auVar120 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar126),auVar103);
        auVar134 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar113),auVar103);
        auVar97 = vblendvps_avx(ZEXT1632(auVar94),auVar97,auVar103);
        auVar18 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar144),auVar103);
        auVar17 = vpackssdw_avx(local_700._0_16_,local_700._16_16_);
        auVar21 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar143),auVar103);
        auVar160 = vsubps_avx(auVar97,auVar114);
        auVar18 = vsubps_avx(auVar18,auVar147);
        auVar19 = vsubps_avx(auVar21,auVar7);
        auVar115 = vsubps_avx(auVar114,auVar102);
        auVar116 = vsubps_avx(auVar147,auVar120);
        auVar20 = vsubps_avx(auVar7,auVar134);
        auVar34._4_4_ = auVar19._4_4_ * auVar114._4_4_;
        auVar34._0_4_ = auVar19._0_4_ * auVar114._0_4_;
        auVar34._8_4_ = auVar19._8_4_ * auVar114._8_4_;
        auVar34._12_4_ = auVar19._12_4_ * auVar114._12_4_;
        auVar34._16_4_ = auVar19._16_4_ * auVar114._16_4_;
        auVar34._20_4_ = auVar19._20_4_ * auVar114._20_4_;
        auVar34._24_4_ = auVar19._24_4_ * auVar114._24_4_;
        auVar34._28_4_ = auVar21._28_4_;
        auVar12 = vfmsub231ps_fma(auVar34,auVar7,auVar160);
        auVar35._4_4_ = auVar160._4_4_ * auVar147._4_4_;
        auVar35._0_4_ = auVar160._0_4_ * auVar147._0_4_;
        auVar35._8_4_ = auVar160._8_4_ * auVar147._8_4_;
        auVar35._12_4_ = auVar160._12_4_ * auVar147._12_4_;
        auVar35._16_4_ = auVar160._16_4_ * auVar147._16_4_;
        auVar35._20_4_ = auVar160._20_4_ * auVar147._20_4_;
        auVar35._24_4_ = auVar160._24_4_ * auVar147._24_4_;
        auVar35._28_4_ = auVar97._28_4_;
        auVar14 = vfmsub231ps_fma(auVar35,auVar114,auVar18);
        auVar158 = ZEXT3264(auVar147);
        auVar194 = ZEXT864(0) << 0x20;
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar99._0_4_ = auVar18._0_4_ * auVar7._0_4_;
        auVar99._4_4_ = auVar18._4_4_ * auVar7._4_4_;
        auVar99._8_4_ = auVar18._8_4_ * auVar7._8_4_;
        auVar99._12_4_ = auVar18._12_4_ * auVar7._12_4_;
        auVar99._16_4_ = auVar18._16_4_ * auVar7._16_4_;
        auVar99._20_4_ = auVar18._20_4_ * auVar7._20_4_;
        auVar99._24_4_ = auVar18._24_4_ * auVar7._24_4_;
        auVar99._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar99,auVar147,auVar19);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar100._0_4_ = auVar20._0_4_ * auVar102._0_4_;
        auVar100._4_4_ = auVar20._4_4_ * auVar102._4_4_;
        auVar100._8_4_ = auVar20._8_4_ * auVar102._8_4_;
        auVar100._12_4_ = auVar20._12_4_ * auVar102._12_4_;
        auVar100._16_4_ = auVar20._16_4_ * auVar102._16_4_;
        auVar100._20_4_ = auVar20._20_4_ * auVar102._20_4_;
        auVar100._24_4_ = auVar20._24_4_ * auVar102._24_4_;
        auVar100._28_4_ = 0;
        auVar12 = vfmsub231ps_fma(auVar100,auVar115,auVar134);
        auVar36._4_4_ = auVar116._4_4_ * auVar134._4_4_;
        auVar36._0_4_ = auVar116._0_4_ * auVar134._0_4_;
        auVar36._8_4_ = auVar116._8_4_ * auVar134._8_4_;
        auVar36._12_4_ = auVar116._12_4_ * auVar134._12_4_;
        auVar36._16_4_ = auVar116._16_4_ * auVar134._16_4_;
        auVar36._20_4_ = auVar116._20_4_ * auVar134._20_4_;
        auVar36._24_4_ = auVar116._24_4_ * auVar134._24_4_;
        auVar36._28_4_ = auVar134._28_4_;
        auVar16 = vfmsub231ps_fma(auVar36,auVar120,auVar20);
        auVar37._4_4_ = auVar115._4_4_ * auVar120._4_4_;
        auVar37._0_4_ = auVar115._0_4_ * auVar120._0_4_;
        auVar37._8_4_ = auVar115._8_4_ * auVar120._8_4_;
        auVar37._12_4_ = auVar115._12_4_ * auVar120._12_4_;
        auVar37._16_4_ = auVar115._16_4_ * auVar120._16_4_;
        auVar37._20_4_ = auVar115._20_4_ * auVar120._20_4_;
        auVar37._24_4_ = auVar115._24_4_ * auVar120._24_4_;
        auVar37._28_4_ = auVar120._28_4_;
        auVar95 = vfmsub231ps_fma(auVar37,auVar116,auVar102);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
        auVar102 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar16));
        auVar102 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,2);
        auVar12 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
        auVar17 = vpand_avx(auVar17,auVar12);
        auVar102 = vpmovsxwd_avx2(auVar17);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar102 >> 0x7f,0) == '\0') &&
              (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar102 >> 0xbf,0) == '\0') &&
            (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar102[0x1f]) {
LAB_01599bbc:
          auVar164 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar203 = ZEXT3264(local_4e0);
          auVar181 = ZEXT3264(local_6c0);
        }
        else {
          auVar38._4_4_ = auVar18._4_4_ * auVar20._4_4_;
          auVar38._0_4_ = auVar18._0_4_ * auVar20._0_4_;
          auVar38._8_4_ = auVar18._8_4_ * auVar20._8_4_;
          auVar38._12_4_ = auVar18._12_4_ * auVar20._12_4_;
          auVar38._16_4_ = auVar18._16_4_ * auVar20._16_4_;
          auVar38._20_4_ = auVar18._20_4_ * auVar20._20_4_;
          auVar38._24_4_ = auVar18._24_4_ * auVar20._24_4_;
          auVar38._28_4_ = auVar102._28_4_;
          auVar126 = vfmsub231ps_fma(auVar38,auVar116,auVar19);
          auVar118._0_4_ = auVar115._0_4_ * auVar19._0_4_;
          auVar118._4_4_ = auVar115._4_4_ * auVar19._4_4_;
          auVar118._8_4_ = auVar115._8_4_ * auVar19._8_4_;
          auVar118._12_4_ = auVar115._12_4_ * auVar19._12_4_;
          auVar118._16_4_ = auVar115._16_4_ * auVar19._16_4_;
          auVar118._20_4_ = auVar115._20_4_ * auVar19._20_4_;
          auVar118._24_4_ = auVar115._24_4_ * auVar19._24_4_;
          auVar118._28_4_ = 0;
          auVar94 = vfmsub231ps_fma(auVar118,auVar160,auVar20);
          auVar39._4_4_ = auVar160._4_4_ * auVar116._4_4_;
          auVar39._0_4_ = auVar160._0_4_ * auVar116._0_4_;
          auVar39._8_4_ = auVar160._8_4_ * auVar116._8_4_;
          auVar39._12_4_ = auVar160._12_4_ * auVar116._12_4_;
          auVar39._16_4_ = auVar160._16_4_ * auVar116._16_4_;
          auVar39._20_4_ = auVar160._20_4_ * auVar116._20_4_;
          auVar39._24_4_ = auVar160._24_4_ * auVar116._24_4_;
          auVar39._28_4_ = auVar160._28_4_;
          auVar113 = vfmsub231ps_fma(auVar39,auVar115,auVar18);
          auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar113));
          auVar95 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar126),_DAT_01faff00);
          auVar102 = vrcpps_avx(ZEXT1632(auVar95));
          auVar190._8_4_ = 0x3f800000;
          auVar190._0_8_ = 0x3f8000003f800000;
          auVar190._12_4_ = 0x3f800000;
          auVar190._16_4_ = 0x3f800000;
          auVar190._20_4_ = 0x3f800000;
          auVar190._24_4_ = 0x3f800000;
          auVar190._28_4_ = 0x3f800000;
          auVar12 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar95),auVar190);
          auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar102,auVar102);
          auVar40._4_4_ = auVar113._4_4_ * auVar7._4_4_;
          auVar40._0_4_ = auVar113._0_4_ * auVar7._0_4_;
          auVar40._8_4_ = auVar113._8_4_ * auVar7._8_4_;
          auVar40._12_4_ = auVar113._12_4_ * auVar7._12_4_;
          auVar40._16_4_ = auVar7._16_4_ * 0.0;
          auVar40._20_4_ = auVar7._20_4_ * 0.0;
          auVar40._24_4_ = auVar7._24_4_ * 0.0;
          auVar40._28_4_ = auVar7._28_4_;
          auVar94 = vfmadd231ps_fma(auVar40,auVar147,ZEXT1632(auVar94));
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar126),auVar114);
          fVar104 = auVar12._0_4_;
          fVar105 = auVar12._4_4_;
          fVar106 = auVar12._8_4_;
          fVar107 = auVar12._12_4_;
          auVar41._28_4_ = auVar147._28_4_;
          auVar41._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * auVar94._12_4_,
                                  CONCAT48(fVar106 * auVar94._8_4_,
                                           CONCAT44(fVar105 * auVar94._4_4_,fVar104 * auVar94._0_4_)
                                          )));
          auVar158 = ZEXT3264(auVar41);
          auVar12 = vpermilps_avx((undefined1  [16])aVar4,0xff);
          auVar101._0_8_ = auVar12._0_8_;
          auVar101._8_8_ = auVar101._0_8_;
          auVar101._16_8_ = auVar101._0_8_;
          auVar101._24_8_ = auVar101._0_8_;
          fVar125 = ray->tfar;
          auVar119._4_4_ = fVar125;
          auVar119._0_4_ = fVar125;
          auVar119._8_4_ = fVar125;
          auVar119._12_4_ = fVar125;
          auVar119._16_4_ = fVar125;
          auVar119._20_4_ = fVar125;
          auVar119._24_4_ = fVar125;
          auVar119._28_4_ = fVar125;
          auVar147 = vcmpps_avx(auVar101,auVar41,2);
          auVar7 = vcmpps_avx(auVar41,auVar119,2);
          auVar147 = vandps_avx(auVar7,auVar147);
          auVar12 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar17 = vpand_avx(auVar17,auVar12);
          auVar147 = vpmovsxwd_avx2(auVar17);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar147[0x1f]) goto LAB_01599bbc;
          auVar147 = vcmpps_avx(ZEXT1632(auVar95),ZEXT832(0) << 0x20,4);
          auVar12 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
          auVar17 = vpand_avx(auVar17,auVar12);
          auVar147 = vpmovsxwd_avx2(auVar17);
          auVar164 = ZEXT3264(CONCAT824(uStack_448,
                                        CONCAT816(uStack_450,CONCAT88(uStack_458,local_460))));
          auVar203 = ZEXT3264(local_4e0);
          auVar181 = ZEXT3264(local_6c0);
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar147 >> 0x7f,0) != '\0') ||
                (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0xbf,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar147[0x1f] < '\0') {
            auVar102 = ZEXT1632(CONCAT412(fVar107 * auVar14._12_4_,
                                          CONCAT48(fVar106 * auVar14._8_4_,
                                                   CONCAT44(fVar105 * auVar14._4_4_,
                                                            fVar104 * auVar14._0_4_))));
            auVar120 = ZEXT1632(CONCAT412(fVar107 * auVar16._12_4_,
                                          CONCAT48(fVar106 * auVar16._8_4_,
                                                   CONCAT44(fVar105 * auVar16._4_4_,
                                                            fVar104 * auVar16._0_4_))));
            auVar146._8_4_ = 0x3f800000;
            auVar146._0_8_ = 0x3f8000003f800000;
            auVar146._12_4_ = 0x3f800000;
            auVar146._16_4_ = 0x3f800000;
            auVar146._20_4_ = 0x3f800000;
            auVar146._24_4_ = 0x3f800000;
            auVar146._28_4_ = 0x3f800000;
            auVar7 = vsubps_avx(auVar146,auVar102);
            auVar7 = vblendvps_avx(auVar7,auVar102,auVar103);
            auVar203 = ZEXT3264(auVar7);
            auVar7 = vsubps_avx(auVar146,auVar120);
            local_380 = vblendvps_avx(auVar7,auVar120,auVar103);
            auVar164 = ZEXT3264(auVar147);
            auVar181 = ZEXT3264(auVar41);
          }
        }
        auVar191 = ZEXT3264(local_680);
        auVar186 = ZEXT3264(auVar186._0_32_);
        auVar147 = auVar164._0_32_;
        _local_4a0 = auVar15;
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0x7f,0) == '\0') &&
              (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
             SUB321(auVar147 >> 0xbf,0) == '\0') &&
            (auVar164 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
            -1 < auVar164[0x1f]) {
          bVar88 = false;
          goto LAB_01598973;
        }
        auVar7 = vsubps_avx(local_440,auVar201);
        local_240 = auVar203._0_32_;
        auVar17 = vfmadd213ps_fma(auVar7,local_240,auVar201);
        fVar125 = pre->depth_scale;
        auVar42._4_4_ = (auVar17._4_4_ + auVar17._4_4_) * fVar125;
        auVar42._0_4_ = (auVar17._0_4_ + auVar17._0_4_) * fVar125;
        auVar42._8_4_ = (auVar17._8_4_ + auVar17._8_4_) * fVar125;
        auVar42._12_4_ = (auVar17._12_4_ + auVar17._12_4_) * fVar125;
        auVar42._16_4_ = fVar125 * 0.0;
        auVar42._20_4_ = fVar125 * 0.0;
        auVar42._24_4_ = fVar125 * 0.0;
        auVar42._28_4_ = 0;
        local_200 = auVar181._0_32_;
        auVar7 = vcmpps_avx(local_200,auVar42,6);
        auVar102 = auVar147 & auVar7;
        auVar164 = ZEXT3264(local_5a0);
        auVar167 = ZEXT3264(CONCAT428(local_620,
                                      CONCAT424(local_620,
                                                CONCAT420(local_620,
                                                          CONCAT416(local_620,
                                                                    CONCAT412(local_620,
                                                                              CONCAT48(local_620,
                                                                                       CONCAT44(
                                                  local_620,local_620))))))));
        auVar172 = ZEXT3264(local_640);
        if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar102 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar102 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar102 >> 0x7f,0) != '\0') ||
              (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar102 >> 0xbf,0) != '\0') ||
            (auVar102 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar102[0x1f] < '\0') {
          auVar121._8_4_ = 0xbf800000;
          auVar121._0_8_ = 0xbf800000bf800000;
          auVar121._12_4_ = 0xbf800000;
          auVar121._16_4_ = 0xbf800000;
          auVar121._20_4_ = 0xbf800000;
          auVar121._24_4_ = 0xbf800000;
          auVar121._28_4_ = 0xbf800000;
          auVar133._8_4_ = 0x40000000;
          auVar133._0_8_ = 0x4000000040000000;
          auVar133._12_4_ = 0x40000000;
          auVar133._16_4_ = 0x40000000;
          auVar133._20_4_ = 0x40000000;
          auVar133._24_4_ = 0x40000000;
          auVar133._28_4_ = 0x40000000;
          auVar17 = vfmadd213ps_fma(local_380,auVar133,auVar121);
          local_380 = ZEXT1632(auVar17);
          auVar102 = local_380;
          local_220 = ZEXT1632(auVar17);
          local_1e0 = 0;
          local_1dc = iVar9;
          local_1d0 = *(undefined8 *)pPVar1;
          uStack_1c8 = *(undefined8 *)(pPVar1 + 8);
          local_1c0 = local_540._0_8_;
          uStack_1b8 = local_540._8_8_;
          local_1b0 = local_550._0_8_;
          uStack_1a8 = local_550._8_8_;
          if ((pGVar86->mask & ray->mask) != 0) {
            _local_780 = ZEXT1632(CONCAT88(auVar13._8_8_,pGVar86));
            auVar123 = ZEXT3264(local_6e0);
            auVar142 = ZEXT3264(local_5c0);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (bVar88 = true, local_550 = auVar112, local_540 = auVar93,
               pGVar86->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar147 = vandps_avx(auVar7,auVar147);
              fVar125 = 1.0 / auVar98._0_4_;
              local_160[0] = fVar125 * (auVar203._0_4_ + 0.0);
              local_160[1] = fVar125 * (auVar203._4_4_ + 1.0);
              local_160[2] = fVar125 * (auVar203._8_4_ + 2.0);
              local_160[3] = fVar125 * (auVar203._12_4_ + 3.0);
              fStack_150 = fVar125 * (auVar203._16_4_ + 4.0);
              fStack_14c = fVar125 * (auVar203._20_4_ + 5.0);
              fStack_148 = fVar125 * (auVar203._24_4_ + 6.0);
              fStack_144 = auVar203._28_4_ + 7.0;
              local_380._0_8_ = auVar17._0_8_;
              local_380._8_8_ = auVar17._8_8_;
              local_140 = local_380._0_8_;
              uStack_138 = local_380._8_8_;
              uStack_130 = 0;
              uStack_128 = 0;
              local_120 = local_200;
              uVar84 = vmovmskps_avx(auVar147);
              local_380 = auVar102;
              if (uVar84 == 0) goto LAB_01598a3c;
              uVar82 = CONCAT44(0,uVar84 & 0xff);
              auStack_738 = auVar114._8_24_;
              local_740 = uVar82;
              lVar87 = 0;
              for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                lVar87 = lVar87 + 1;
              }
              local_500._0_4_ = ray->tfar;
              local_4e0 = local_240;
              local_6c0 = local_200;
              local_550 = auVar112;
              local_540 = auVar93;
              do {
                local_524 = local_160[lVar87];
                local_520 = *(undefined4 *)((long)&local_140 + lVar87 * 4);
                local_700._0_8_ = lVar87;
                ray->tfar = *(float *)(local_120 + lVar87 * 4);
                local_5f0.context = context->user;
                fVar104 = 1.0 - local_524;
                fVar125 = fVar104 * fVar104 * -3.0;
                auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar104)),
                                          ZEXT416((uint)(local_524 * fVar104)),ZEXT416(0xc0000000));
                auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_524 * fVar104)),
                                          ZEXT416((uint)(local_524 * local_524)),ZEXT416(0x40000000)
                                         );
                fVar104 = auVar17._0_4_ * 3.0;
                fVar105 = auVar12._0_4_ * 3.0;
                fVar106 = local_524 * local_524 * 3.0;
                auVar153._0_4_ = fVar106 * (float)local_470._0_4_;
                auVar153._4_4_ = fVar106 * (float)local_470._4_4_;
                auVar153._8_4_ = fVar106 * fStack_468;
                auVar153._12_4_ = fVar106 * fStack_464;
                auVar158 = ZEXT1664(auVar153);
                auVar128._4_4_ = fVar105;
                auVar128._0_4_ = fVar105;
                auVar128._8_4_ = fVar105;
                auVar128._12_4_ = fVar105;
                auVar17 = vfmadd132ps_fma(auVar128,auVar153,local_550);
                auVar138._4_4_ = fVar104;
                auVar138._0_4_ = fVar104;
                auVar138._8_4_ = fVar104;
                auVar138._12_4_ = fVar104;
                auVar17 = vfmadd132ps_fma(auVar138,auVar17,local_540);
                auVar129._4_4_ = fVar125;
                auVar129._0_4_ = fVar125;
                auVar129._8_4_ = fVar125;
                auVar129._12_4_ = fVar125;
                auVar77._8_8_ = uStack_5f8;
                auVar77._0_8_ = local_600;
                auVar17 = vfmadd132ps_fma(auVar129,auVar17,auVar77);
                local_530 = vmovlps_avx(auVar17);
                local_528 = vextractps_avx(auVar17,2);
                local_51c = local_744;
                local_518 = (int)local_648;
                local_514 = (local_5f0.context)->instID[0];
                local_510 = (local_5f0.context)->instPrimID[0];
                local_794 = -1;
                local_5f0.valid = &local_794;
                local_5f0.geometryUserPtr = *(void **)((long)local_780 + 0x18);
                local_5f0.ray = (RTCRayN *)ray;
                local_5f0.hit = (RTCHitN *)&local_530;
                local_5f0.N = 1;
                if (*(code **)((long)local_780 + 0x48) == (code *)0x0) {
LAB_01598d25:
                  p_Var10 = context->args->filter;
                  if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)((long)local_780 + 0x3e) & 0x40) != 0)))) {
                    auVar158 = ZEXT1664(auVar158._0_16_);
                    auVar194 = ZEXT1664(auVar194._0_16_);
                    (*p_Var10)(&local_5f0);
                    if (*local_5f0.valid == 0) goto LAB_01598d6e;
                  }
                  bVar88 = true;
                  pre = local_788;
                  goto LAB_015983a6;
                }
                auVar158 = ZEXT1664(auVar153);
                auVar194 = ZEXT1664(auVar194._0_16_);
                (**(code **)((long)local_780 + 0x48))(&local_5f0);
                if (*local_5f0.valid != 0) goto LAB_01598d25;
LAB_01598d6e:
                ray->tfar = (float)local_500._0_4_;
                uVar83 = local_740 ^ 1L << (local_700._0_8_ & 0x3f);
                bVar88 = false;
                local_740 = uVar83;
                lVar87 = 0;
                for (uVar82 = uVar83; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
                {
                  lVar87 = lVar87 + 1;
                }
                auVar203 = ZEXT3264(local_4e0);
                auVar123 = ZEXT3264(local_6e0);
                auVar181 = ZEXT3264(local_6c0);
                auVar186 = ZEXT3264(local_6a0);
                auVar191 = ZEXT3264(local_680);
                auVar164 = ZEXT3264(local_5a0);
                auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                              CONCAT424(fStack_608,
                                                        CONCAT420(fStack_60c,
                                                                  CONCAT416(fStack_610,
                                                                            CONCAT412(fStack_614,
                                                                                      CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                auVar172 = ZEXT3264(local_640);
                auVar142 = ZEXT3264(local_5c0);
                pre = local_788;
              } while (uVar83 != 0);
            }
            goto LAB_01598997;
          }
          bVar88 = false;
          local_550 = auVar112;
          local_540 = auVar93;
          goto LAB_0159898e;
        }
LAB_01598a3c:
        auVar142 = ZEXT3264(local_5c0);
        bVar88 = false;
        auVar123 = ZEXT3264(local_6e0);
        local_550 = auVar112;
        local_540 = auVar93;
      }
LAB_01598997:
      local_6e0 = auVar123._0_32_;
      if (8 < iVar9) {
        local_300._4_4_ = iVar9;
        local_300._0_4_ = iVar9;
        local_300._8_4_ = iVar9;
        local_300._12_4_ = iVar9;
        local_300._16_4_ = iVar9;
        local_300._20_4_ = iVar9;
        local_300._24_4_ = iVar9;
        local_300._28_4_ = iVar9;
        local_360._4_4_ = local_720._0_4_;
        local_360._0_4_ = local_720._0_4_;
        local_360._8_4_ = local_720._0_4_;
        local_360._12_4_ = local_720._0_4_;
        local_360._16_4_ = local_720._0_4_;
        local_360._20_4_ = local_720._0_4_;
        local_360._24_4_ = local_720._0_4_;
        local_360._28_4_ = local_720._0_4_;
        auVar17 = vpermilps_avx(local_4c0._0_16_,0xff);
        local_100 = auVar17._0_8_;
        uStack_f8 = local_100;
        uStack_f0 = local_100;
        uStack_e8 = local_100;
        local_420._0_4_ = 1.0 / (float)local_420;
        local_420._4_4_ = (float)local_420;
        uStack_418._0_4_ = (float)local_420;
        uStack_418._4_4_ = (float)local_420;
        fStack_410 = (float)local_420;
        fStack_40c = (float)local_420;
        fStack_408 = (float)local_420;
        fStack_404 = (float)local_420;
        lVar87 = 8;
        local_4e0 = auVar203._0_32_;
        local_6c0 = auVar181._0_32_;
        fVar125 = (float)local_580;
        fVar104 = local_580._4_4_;
        fVar105 = (float)uStack_578;
        fVar106 = uStack_578._4_4_;
        fVar107 = (float)uStack_570;
        fVar108 = uStack_570._4_4_;
        fVar109 = (float)uStack_568;
        do {
          auVar98 = auVar186._0_32_;
          local_6e0 = auVar123._0_32_;
          auVar114 = *(undefined1 (*) [32])(bezier_basis0 + lVar87 * 4 + lVar22);
          auVar147 = *(undefined1 (*) [32])(lVar22 + 0x21aa768 + lVar87 * 4);
          auVar7 = *(undefined1 (*) [32])(lVar22 + 0x21aabec + lVar87 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar22 + 0x21ab070 + lVar87 * 4);
          fVar110 = *(float *)*pauVar2;
          fVar124 = *(float *)(*pauVar2 + 4);
          fVar173 = *(float *)(*pauVar2 + 8);
          fVar174 = *(float *)(*pauVar2 + 0xc);
          fVar175 = *(float *)(*pauVar2 + 0x10);
          fVar182 = *(float *)(*pauVar2 + 0x14);
          fVar183 = *(float *)(*pauVar2 + 0x18);
          auVar80 = *(undefined1 (*) [28])*pauVar2;
          auVar123._0_4_ = fVar110 * auVar167._0_4_;
          auVar123._4_4_ = fVar124 * auVar167._4_4_;
          auVar123._8_4_ = fVar173 * auVar167._8_4_;
          auVar123._12_4_ = fVar174 * auVar167._12_4_;
          auVar123._16_4_ = fVar175 * auVar167._16_4_;
          auVar123._20_4_ = fVar182 * auVar167._20_4_;
          auVar123._28_36_ = auVar194._28_36_;
          auVar123._24_4_ = fVar183 * auVar167._24_4_;
          auVar181._0_4_ = fVar110 * fVar125;
          auVar181._4_4_ = fVar124 * fVar104;
          auVar181._8_4_ = fVar173 * fVar105;
          auVar181._12_4_ = fVar174 * fVar106;
          auVar181._16_4_ = fVar175 * fVar107;
          auVar181._20_4_ = fVar182 * fVar108;
          auVar181._28_36_ = auVar158._28_36_;
          auVar181._24_4_ = fVar183 * fVar109;
          auVar17 = vfmadd231ps_fma(auVar123._0_32_,auVar7,auVar191._0_32_);
          auVar160 = auVar164._0_32_;
          auVar12 = vfmadd231ps_fma(auVar181._0_32_,auVar7,auVar160);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar147,auVar172._0_32_);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar147,local_2a0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar114,auVar142._0_32_);
          auVar194 = ZEXT1664(auVar17);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar114,local_3e0);
          local_720 = *(undefined1 (*) [32])(bezier_basis1 + lVar87 * 4 + lVar22);
          auVar102 = *(undefined1 (*) [32])(lVar22 + 0x21acb88 + lVar87 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar22 + 0x21ad00c + lVar87 * 4);
          pfVar3 = (float *)(lVar22 + 0x21ad490 + lVar87 * 4);
          fVar195 = *pfVar3;
          fVar196 = pfVar3[1];
          fVar197 = pfVar3[2];
          fVar198 = pfVar3[3];
          fVar74 = pfVar3[4];
          fVar75 = pfVar3[5];
          fVar76 = pfVar3[6];
          auVar203._0_4_ = fVar195 * auVar167._0_4_;
          auVar203._4_4_ = fVar196 * auVar167._4_4_;
          auVar203._8_4_ = fVar197 * auVar167._8_4_;
          auVar203._12_4_ = fVar198 * auVar167._12_4_;
          auVar203._16_4_ = fVar74 * auVar167._16_4_;
          auVar203._20_4_ = fVar75 * auVar167._20_4_;
          auVar203._28_36_ = auVar167._28_36_;
          auVar203._24_4_ = fVar76 * auVar167._24_4_;
          auVar158._0_4_ = fVar125 * fVar195;
          auVar158._4_4_ = fVar104 * fVar196;
          auVar158._8_4_ = fVar105 * fVar197;
          auVar158._12_4_ = fVar106 * fVar198;
          auVar158._16_4_ = fVar107 * fVar74;
          auVar158._20_4_ = fVar108 * fVar75;
          auVar158._28_36_ = auVar191._28_36_;
          auVar158._24_4_ = fVar109 * fVar76;
          auVar13 = vfmadd231ps_fma(auVar203._0_32_,auVar120,auVar191._0_32_);
          auVar14 = vfmadd231ps_fma(auVar158._0_32_,auVar120,auVar160);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,auVar172._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar102,local_2a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_720,auVar142._0_32_);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_720,local_3e0);
          local_440 = ZEXT1632(auVar13);
          local_2c0 = ZEXT1632(auVar17);
          auVar97 = vsubps_avx(local_440,local_2c0);
          local_4c0 = ZEXT1632(auVar12);
          local_340 = ZEXT1632(auVar14);
          auVar18 = vsubps_avx(local_340,local_4c0);
          auVar73._4_4_ = auVar97._4_4_ * auVar12._4_4_;
          auVar73._0_4_ = auVar97._0_4_ * auVar12._0_4_;
          auVar73._8_4_ = auVar97._8_4_ * auVar12._8_4_;
          auVar73._12_4_ = auVar97._12_4_ * auVar12._12_4_;
          auVar73._16_4_ = auVar97._16_4_ * 0.0;
          auVar73._20_4_ = auVar97._20_4_ * 0.0;
          auVar73._24_4_ = auVar97._24_4_ * 0.0;
          auVar73._28_4_ = local_3e0._28_4_;
          auVar158 = ZEXT3264(auVar7);
          fVar125 = auVar18._0_4_;
          fVar104 = auVar18._4_4_;
          auVar43._4_4_ = auVar17._4_4_ * fVar104;
          auVar43._0_4_ = auVar17._0_4_ * fVar125;
          fVar105 = auVar18._8_4_;
          auVar43._8_4_ = auVar17._8_4_ * fVar105;
          fVar106 = auVar18._12_4_;
          auVar43._12_4_ = auVar17._12_4_ * fVar106;
          fVar107 = auVar18._16_4_;
          auVar43._16_4_ = fVar107 * 0.0;
          fVar108 = auVar18._20_4_;
          auVar43._20_4_ = fVar108 * 0.0;
          fVar109 = auVar18._24_4_;
          auVar43._24_4_ = fVar109 * 0.0;
          auVar43._28_4_ = local_2a0._28_4_;
          auVar21 = vsubps_avx(auVar73,auVar43);
          _local_2e0 = *pauVar2;
          auVar19 = _local_2e0;
          auVar186._0_4_ = fVar110 * (float)local_e0;
          auVar186._4_4_ = fVar124 * local_e0._4_4_;
          auVar186._8_4_ = fVar173 * (float)uStack_d8;
          auVar186._12_4_ = fVar174 * uStack_d8._4_4_;
          auVar186._16_4_ = fVar175 * (float)uStack_d0;
          auVar186._20_4_ = fVar182 * uStack_d0._4_4_;
          auVar186._28_36_ = auVar164._28_36_;
          auVar186._24_4_ = fVar183 * (float)uStack_c8;
          auVar17 = vfmadd231ps_fma(auVar186._0_32_,auVar7,local_c0);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_a0,auVar147);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_80,auVar114);
          auVar44._4_4_ = fVar196 * local_e0._4_4_;
          auVar44._0_4_ = fVar195 * (float)local_e0;
          auVar44._8_4_ = fVar197 * (float)uStack_d8;
          auVar44._12_4_ = fVar198 * uStack_d8._4_4_;
          auVar44._16_4_ = fVar74 * (float)uStack_d0;
          auVar44._20_4_ = fVar75 * uStack_d0._4_4_;
          auVar44._24_4_ = fVar76 * (float)uStack_c8;
          auVar44._28_4_ = uStack_c8._4_4_;
          auVar13 = vfmadd231ps_fma(auVar44,auVar120,local_c0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar102,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_720,local_80);
          auVar45._4_4_ = fVar104 * fVar104;
          auVar45._0_4_ = fVar125 * fVar125;
          auVar45._8_4_ = fVar105 * fVar105;
          auVar45._12_4_ = fVar106 * fVar106;
          auVar45._16_4_ = fVar107 * fVar107;
          auVar45._20_4_ = fVar108 * fVar108;
          auVar45._24_4_ = fVar109 * fVar109;
          auVar45._28_4_ = local_80._28_4_;
          auVar14 = vfmadd231ps_fma(auVar45,auVar97,auVar97);
          auVar134 = vmaxps_avx(ZEXT1632(auVar17),ZEXT1632(auVar13));
          auVar178._0_4_ = auVar134._0_4_ * auVar134._0_4_ * auVar14._0_4_;
          auVar178._4_4_ = auVar134._4_4_ * auVar134._4_4_ * auVar14._4_4_;
          auVar178._8_4_ = auVar134._8_4_ * auVar134._8_4_ * auVar14._8_4_;
          auVar178._12_4_ = auVar134._12_4_ * auVar134._12_4_ * auVar14._12_4_;
          auVar178._16_4_ = auVar134._16_4_ * auVar134._16_4_ * 0.0;
          auVar178._20_4_ = auVar134._20_4_ * auVar134._20_4_ * 0.0;
          auVar178._24_4_ = auVar134._24_4_ * auVar134._24_4_ * 0.0;
          auVar178._28_4_ = 0;
          auVar46._4_4_ = auVar21._4_4_ * auVar21._4_4_;
          auVar46._0_4_ = auVar21._0_4_ * auVar21._0_4_;
          auVar46._8_4_ = auVar21._8_4_ * auVar21._8_4_;
          auVar46._12_4_ = auVar21._12_4_ * auVar21._12_4_;
          auVar46._16_4_ = auVar21._16_4_ * auVar21._16_4_;
          auVar46._20_4_ = auVar21._20_4_ * auVar21._20_4_;
          auVar46._24_4_ = auVar21._24_4_ * auVar21._24_4_;
          auVar46._28_4_ = auVar21._28_4_;
          auVar134 = vcmpps_avx(auVar46,auVar178,2);
          local_1e0 = (int)lVar87;
          auVar179._4_4_ = local_1e0;
          auVar179._0_4_ = local_1e0;
          auVar179._8_4_ = local_1e0;
          auVar179._12_4_ = local_1e0;
          auVar179._16_4_ = local_1e0;
          auVar179._20_4_ = local_1e0;
          auVar179._24_4_ = local_1e0;
          auVar179._28_4_ = local_1e0;
          auVar21 = vpor_avx2(auVar179,_DAT_01fe9900);
          auVar103 = vpcmpgtd_avx2(local_300,auVar21);
          auVar21 = auVar103 & auVar134;
          fVar125 = (float)local_580;
          fVar104 = local_580._4_4_;
          fVar105 = (float)uStack_578;
          fVar106 = uStack_578._4_4_;
          fVar107 = (float)uStack_570;
          fVar108 = uStack_570._4_4_;
          fVar109 = (float)uStack_568;
          if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar21 >> 0x7f,0) == '\0') &&
                (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar21 >> 0xbf,0) == '\0') &&
              (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar21[0x1f]) {
            auVar186 = ZEXT3264(auVar98);
LAB_01599667:
            auVar191 = ZEXT3264(local_680);
            auVar181 = ZEXT3264(local_6c0);
            auVar164 = ZEXT3264(auVar160);
            auVar123 = ZEXT3264(local_6e0);
            auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar172 = ZEXT3264(local_640);
          }
          else {
            local_320 = vandps_avx(auVar103,auVar134);
            auVar47._4_4_ = fVar196 * local_4a0._4_4_;
            auVar47._0_4_ = fVar195 * (float)local_4a0;
            auVar47._8_4_ = fVar197 * (float)uStack_498;
            auVar47._12_4_ = fVar198 * uStack_498._4_4_;
            auVar47._16_4_ = fVar74 * (float)uStack_490;
            auVar47._20_4_ = fVar75 * uStack_490._4_4_;
            auVar47._24_4_ = fVar76 * (float)uStack_488;
            auVar47._28_4_ = auVar134._28_4_;
            auVar14 = vfmadd213ps_fma(auVar120,local_3c0,auVar47);
            auVar14 = vfmadd213ps_fma(auVar102,local_280,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(local_720,ZEXT1632(auVar14),local_400);
            local_2e0._0_4_ = auVar80._0_4_;
            local_2e0._4_4_ = auVar80._4_4_;
            fStack_2d8 = auVar80._8_4_;
            fStack_2d4 = auVar80._12_4_;
            fStack_2d0 = auVar80._16_4_;
            fStack_2cc = auVar80._20_4_;
            fStack_2c8 = auVar80._24_4_;
            auVar48._4_4_ = local_4a0._4_4_ * (float)local_2e0._4_4_;
            auVar48._0_4_ = (float)local_4a0 * (float)local_2e0._0_4_;
            auVar48._8_4_ = (float)uStack_498 * fStack_2d8;
            auVar48._12_4_ = uStack_498._4_4_ * fStack_2d4;
            auVar48._16_4_ = (float)uStack_490 * fStack_2d0;
            auVar48._20_4_ = uStack_490._4_4_ * fStack_2cc;
            auVar48._24_4_ = (float)uStack_488 * fStack_2c8;
            auVar48._28_4_ = auVar134._28_4_;
            auVar15 = vfmadd213ps_fma(auVar7,local_3c0,auVar48);
            auVar15 = vfmadd213ps_fma(auVar147,local_280,ZEXT1632(auVar15));
            auVar147 = *(undefined1 (*) [32])(lVar22 + 0x21ab4f4 + lVar87 * 4);
            auVar7 = *(undefined1 (*) [32])(lVar22 + 0x21ab978 + lVar87 * 4);
            auVar102 = *(undefined1 (*) [32])(lVar22 + 0x21abdfc + lVar87 * 4);
            pfVar3 = (float *)(lVar22 + 0x21ac280 + lVar87 * 4);
            fVar110 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar173 = pfVar3[2];
            fVar174 = pfVar3[3];
            fVar175 = pfVar3[4];
            fVar182 = pfVar3[5];
            fVar183 = pfVar3[6];
            auVar49._4_4_ = fStack_61c * fVar124;
            auVar49._0_4_ = local_620 * fVar110;
            auVar49._8_4_ = fStack_618 * fVar173;
            auVar49._12_4_ = fStack_614 * fVar174;
            auVar49._16_4_ = fStack_610 * fVar175;
            auVar49._20_4_ = fStack_60c * fVar182;
            auVar49._24_4_ = fStack_608 * fVar183;
            auVar49._28_4_ = auVar97._28_4_;
            auVar192._0_4_ = (float)local_580 * fVar110;
            auVar192._4_4_ = local_580._4_4_ * fVar124;
            auVar192._8_4_ = (float)uStack_578 * fVar173;
            auVar192._12_4_ = uStack_578._4_4_ * fVar174;
            auVar192._16_4_ = (float)uStack_570 * fVar175;
            auVar192._20_4_ = uStack_570._4_4_ * fVar182;
            auVar192._24_4_ = (float)uStack_568 * fVar183;
            auVar192._28_4_ = 0;
            auVar50._4_4_ = fVar124 * local_4a0._4_4_;
            auVar50._0_4_ = fVar110 * (float)local_4a0;
            auVar50._8_4_ = fVar173 * (float)uStack_498;
            auVar50._12_4_ = fVar174 * uStack_498._4_4_;
            auVar50._16_4_ = fVar175 * (float)uStack_490;
            auVar50._20_4_ = fVar182 * uStack_490._4_4_;
            auVar50._24_4_ = fVar183 * (float)uStack_488;
            auVar50._28_4_ = pfVar3[7];
            auVar16 = vfmadd231ps_fma(auVar49,auVar102,local_680);
            auVar95 = vfmadd231ps_fma(auVar192,auVar102,auVar160);
            auVar94 = vfmadd231ps_fma(auVar50,local_3c0,auVar102);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,local_640);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar7,local_2a0);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),local_280,auVar7);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar147,local_5c0);
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar147,local_3e0);
            auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar147,local_400);
            pfVar3 = (float *)(lVar22 + 0x21ae6a0 + lVar87 * 4);
            fVar110 = *pfVar3;
            fVar124 = pfVar3[1];
            fVar173 = pfVar3[2];
            fVar174 = pfVar3[3];
            fVar175 = pfVar3[4];
            fVar182 = pfVar3[5];
            fVar183 = pfVar3[6];
            auVar51._4_4_ = fStack_61c * fVar124;
            auVar51._0_4_ = local_620 * fVar110;
            auVar51._8_4_ = fStack_618 * fVar173;
            auVar51._12_4_ = fStack_614 * fVar174;
            auVar51._16_4_ = fStack_610 * fVar175;
            auVar51._20_4_ = fStack_60c * fVar182;
            auVar51._24_4_ = fStack_608 * fVar183;
            auVar51._28_4_ = fStack_604;
            auVar52._4_4_ = local_580._4_4_ * fVar124;
            auVar52._0_4_ = (float)local_580 * fVar110;
            auVar52._8_4_ = (float)uStack_578 * fVar173;
            auVar52._12_4_ = uStack_578._4_4_ * fVar174;
            auVar52._16_4_ = (float)uStack_570 * fVar175;
            auVar52._20_4_ = uStack_570._4_4_ * fVar182;
            auVar52._24_4_ = (float)uStack_568 * fVar183;
            auVar52._28_4_ = uStack_568._4_4_;
            auVar53._4_4_ = fVar124 * local_4a0._4_4_;
            auVar53._0_4_ = fVar110 * (float)local_4a0;
            auVar53._8_4_ = fVar173 * (float)uStack_498;
            auVar53._12_4_ = fVar174 * uStack_498._4_4_;
            auVar53._16_4_ = fVar175 * (float)uStack_490;
            auVar53._20_4_ = fVar182 * uStack_490._4_4_;
            auVar53._24_4_ = fVar183 * (float)uStack_488;
            auVar53._28_4_ = pfVar3[7];
            auVar147 = *(undefined1 (*) [32])(lVar22 + 0x21ae21c + lVar87 * 4);
            auVar126 = vfmadd231ps_fma(auVar51,auVar147,local_680);
            auVar112 = vfmadd231ps_fma(auVar52,auVar147,auVar160);
            auVar93 = vfmadd231ps_fma(auVar53,local_3c0,auVar147);
            auVar147 = *(undefined1 (*) [32])(lVar22 + 0x21add98 + lVar87 * 4);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar147,local_640);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar147,local_2a0);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_280,auVar147);
            auVar147 = *(undefined1 (*) [32])(lVar22 + 0x21ad914 + lVar87 * 4);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar147,local_5c0);
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar147,local_3e0);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_400,auVar147);
            auVar180._8_4_ = 0x7fffffff;
            auVar180._0_8_ = 0x7fffffff7fffffff;
            auVar180._12_4_ = 0x7fffffff;
            auVar180._16_4_ = 0x7fffffff;
            auVar180._20_4_ = 0x7fffffff;
            auVar180._24_4_ = 0x7fffffff;
            auVar180._28_4_ = 0x7fffffff;
            auVar147 = vandps_avx(ZEXT1632(auVar16),auVar180);
            auVar7 = vandps_avx(ZEXT1632(auVar95),auVar180);
            auVar7 = vmaxps_avx(auVar147,auVar7);
            auVar147 = vandps_avx(ZEXT1632(auVar94),auVar180);
            auVar147 = vmaxps_avx(auVar7,auVar147);
            auVar147 = vcmpps_avx(auVar147,local_360,1);
            auVar102 = vblendvps_avx(ZEXT1632(auVar16),auVar97,auVar147);
            auVar120 = vblendvps_avx(ZEXT1632(auVar95),auVar18,auVar147);
            auVar147 = vandps_avx(ZEXT1632(auVar126),auVar180);
            auVar7 = vandps_avx(ZEXT1632(auVar112),auVar180);
            auVar7 = vmaxps_avx(auVar147,auVar7);
            auVar147 = vandps_avx(auVar180,ZEXT1632(auVar93));
            auVar147 = vmaxps_avx(auVar7,auVar147);
            auVar7 = vcmpps_avx(auVar147,local_360,1);
            auVar147 = vblendvps_avx(ZEXT1632(auVar126),auVar97,auVar7);
            auVar7 = vblendvps_avx(ZEXT1632(auVar112),auVar18,auVar7);
            auVar15 = vfmadd213ps_fma(auVar114,local_400,ZEXT1632(auVar15));
            auVar16 = vfmadd213ps_fma(auVar102,auVar102,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,auVar120);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar16));
            fVar110 = auVar114._0_4_;
            fVar124 = auVar114._4_4_;
            fVar173 = auVar114._8_4_;
            fVar174 = auVar114._12_4_;
            fVar175 = auVar114._16_4_;
            fVar182 = auVar114._20_4_;
            fVar183 = auVar114._24_4_;
            auVar54._4_4_ = fVar124 * fVar124 * fVar124 * auVar16._4_4_ * -0.5;
            auVar54._0_4_ = fVar110 * fVar110 * fVar110 * auVar16._0_4_ * -0.5;
            auVar54._8_4_ = fVar173 * fVar173 * fVar173 * auVar16._8_4_ * -0.5;
            auVar54._12_4_ = fVar174 * fVar174 * fVar174 * auVar16._12_4_ * -0.5;
            auVar54._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar54._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar54._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar54._28_4_ = 0;
            auVar202._8_4_ = 0x3fc00000;
            auVar202._0_8_ = 0x3fc000003fc00000;
            auVar202._12_4_ = 0x3fc00000;
            auVar202._16_4_ = 0x3fc00000;
            auVar202._20_4_ = 0x3fc00000;
            auVar202._24_4_ = 0x3fc00000;
            auVar202._28_4_ = 0x3fc00000;
            auVar16 = vfmadd231ps_fma(auVar54,auVar202,auVar114);
            fVar110 = auVar16._0_4_;
            fVar124 = auVar16._4_4_;
            auVar55._4_4_ = auVar120._4_4_ * fVar124;
            auVar55._0_4_ = auVar120._0_4_ * fVar110;
            fVar173 = auVar16._8_4_;
            auVar55._8_4_ = auVar120._8_4_ * fVar173;
            fVar174 = auVar16._12_4_;
            auVar55._12_4_ = auVar120._12_4_ * fVar174;
            auVar55._16_4_ = auVar120._16_4_ * 0.0;
            auVar55._20_4_ = auVar120._20_4_ * 0.0;
            auVar55._24_4_ = auVar120._24_4_ * 0.0;
            auVar55._28_4_ = auVar114._28_4_;
            auVar56._4_4_ = fVar124 * -auVar102._4_4_;
            auVar56._0_4_ = fVar110 * -auVar102._0_4_;
            auVar56._8_4_ = fVar173 * -auVar102._8_4_;
            auVar56._12_4_ = fVar174 * -auVar102._12_4_;
            auVar56._16_4_ = -auVar102._16_4_ * 0.0;
            auVar56._20_4_ = -auVar102._20_4_ * 0.0;
            auVar56._24_4_ = -auVar102._24_4_ * 0.0;
            auVar56._28_4_ = auVar120._28_4_;
            auVar16 = vfmadd213ps_fma(auVar147,auVar147,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar7,auVar7);
            auVar114 = vrsqrtps_avx(ZEXT1632(auVar16));
            auVar57._28_4_ = auVar97._28_4_;
            auVar57._0_28_ =
                 ZEXT1628(CONCAT412(fVar174 * 0.0,
                                    CONCAT48(fVar173 * 0.0,CONCAT44(fVar124 * 0.0,fVar110 * 0.0))));
            fVar110 = auVar114._0_4_;
            fVar124 = auVar114._4_4_;
            fVar173 = auVar114._8_4_;
            fVar174 = auVar114._12_4_;
            fVar175 = auVar114._16_4_;
            fVar182 = auVar114._20_4_;
            fVar183 = auVar114._24_4_;
            auVar58._4_4_ = fVar124 * fVar124 * fVar124 * auVar16._4_4_ * -0.5;
            auVar58._0_4_ = fVar110 * fVar110 * fVar110 * auVar16._0_4_ * -0.5;
            auVar58._8_4_ = fVar173 * fVar173 * fVar173 * auVar16._8_4_ * -0.5;
            auVar58._12_4_ = fVar174 * fVar174 * fVar174 * auVar16._12_4_ * -0.5;
            auVar58._16_4_ = fVar175 * fVar175 * fVar175 * -0.0;
            auVar58._20_4_ = fVar182 * fVar182 * fVar182 * -0.0;
            auVar58._24_4_ = fVar183 * fVar183 * fVar183 * -0.0;
            auVar58._28_4_ = 0;
            auVar16 = vfmadd231ps_fma(auVar58,auVar202,auVar114);
            fVar110 = auVar16._0_4_;
            fVar124 = auVar16._4_4_;
            auVar59._4_4_ = auVar7._4_4_ * fVar124;
            auVar59._0_4_ = auVar7._0_4_ * fVar110;
            fVar173 = auVar16._8_4_;
            auVar59._8_4_ = auVar7._8_4_ * fVar173;
            fVar174 = auVar16._12_4_;
            auVar59._12_4_ = auVar7._12_4_ * fVar174;
            auVar59._16_4_ = auVar7._16_4_ * 0.0;
            auVar59._20_4_ = auVar7._20_4_ * 0.0;
            auVar59._24_4_ = auVar7._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = fVar124 * -auVar147._4_4_;
            auVar60._0_4_ = fVar110 * -auVar147._0_4_;
            auVar60._8_4_ = fVar173 * -auVar147._8_4_;
            auVar60._12_4_ = fVar174 * -auVar147._12_4_;
            auVar60._16_4_ = -auVar147._16_4_ * 0.0;
            auVar60._20_4_ = -auVar147._20_4_ * 0.0;
            auVar60._24_4_ = -auVar147._24_4_ * 0.0;
            auVar60._28_4_ = auVar114._28_4_;
            auVar61._28_4_ = 0xbf000000;
            auVar61._0_28_ =
                 ZEXT1628(CONCAT412(fVar174 * 0.0,
                                    CONCAT48(fVar173 * 0.0,CONCAT44(fVar124 * 0.0,fVar110 * 0.0))));
            auVar16 = vfmadd213ps_fma(auVar55,ZEXT1632(auVar17),local_2c0);
            auVar114 = ZEXT1632(auVar17);
            auVar95 = vfmadd213ps_fma(auVar56,auVar114,local_4c0);
            auVar94 = vfmadd213ps_fma(auVar57,auVar114,ZEXT1632(auVar15));
            auVar113 = vfnmadd213ps_fma(auVar55,auVar114,local_2c0);
            auVar126 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar13),local_440);
            auVar136 = vfnmadd213ps_fma(auVar56,auVar114,local_4c0);
            auVar114 = ZEXT1632(auVar13);
            auVar112 = vfmadd213ps_fma(auVar60,auVar114,local_340);
            auVar161 = ZEXT1632(auVar17);
            auVar111 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar161,auVar57);
            auVar15 = vfmadd213ps_fma(auVar61,auVar114,ZEXT1632(auVar14));
            auVar144 = vfnmadd213ps_fma(auVar59,auVar114,local_440);
            auVar92 = vfnmadd213ps_fma(auVar60,auVar114,local_340);
            auVar143 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar61);
            auVar114 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar136));
            auVar147 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar111));
            auVar162._0_4_ = auVar114._0_4_ * auVar111._0_4_;
            auVar162._4_4_ = auVar114._4_4_ * auVar111._4_4_;
            auVar162._8_4_ = auVar114._8_4_ * auVar111._8_4_;
            auVar162._12_4_ = auVar114._12_4_ * auVar111._12_4_;
            auVar162._16_4_ = auVar114._16_4_ * 0.0;
            auVar162._20_4_ = auVar114._20_4_ * 0.0;
            auVar162._24_4_ = auVar114._24_4_ * 0.0;
            auVar162._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar162,ZEXT1632(auVar136),auVar147);
            auVar62._4_4_ = auVar113._4_4_ * auVar147._4_4_;
            auVar62._0_4_ = auVar113._0_4_ * auVar147._0_4_;
            auVar62._8_4_ = auVar113._8_4_ * auVar147._8_4_;
            auVar62._12_4_ = auVar113._12_4_ * auVar147._12_4_;
            auVar62._16_4_ = auVar147._16_4_ * 0.0;
            auVar62._20_4_ = auVar147._20_4_ * 0.0;
            auVar62._24_4_ = auVar147._24_4_ * 0.0;
            auVar62._28_4_ = auVar147._28_4_;
            auVar97 = ZEXT1632(auVar113);
            auVar147 = vsubps_avx(ZEXT1632(auVar126),auVar97);
            auVar103 = ZEXT1632(auVar111);
            auVar14 = vfmsub231ps_fma(auVar62,auVar103,auVar147);
            auVar63._4_4_ = auVar136._4_4_ * auVar147._4_4_;
            auVar63._0_4_ = auVar136._0_4_ * auVar147._0_4_;
            auVar63._8_4_ = auVar136._8_4_ * auVar147._8_4_;
            auVar63._12_4_ = auVar136._12_4_ * auVar147._12_4_;
            auVar63._16_4_ = auVar147._16_4_ * 0.0;
            auVar63._20_4_ = auVar147._20_4_ * 0.0;
            auVar63._24_4_ = auVar147._24_4_ * 0.0;
            auVar63._28_4_ = auVar147._28_4_;
            auVar113 = vfmsub231ps_fma(auVar63,auVar97,auVar114);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar93));
            auVar160 = vcmpps_avx(ZEXT1632(auVar14),ZEXT832(0) << 0x20,2);
            auVar114 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar16),auVar160);
            auVar147 = vblendvps_avx(ZEXT1632(auVar92),ZEXT1632(auVar95),auVar160);
            auVar7 = vblendvps_avx(ZEXT1632(auVar143),ZEXT1632(auVar94),auVar160);
            auVar102 = vblendvps_avx(auVar97,ZEXT1632(auVar126),auVar160);
            auVar120 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar112),auVar160);
            auVar134 = vblendvps_avx(auVar103,ZEXT1632(auVar15),auVar160);
            auVar97 = vblendvps_avx(ZEXT1632(auVar126),auVar97,auVar160);
            auVar21 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar136),auVar160);
            auVar14 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
            local_720 = ZEXT1632(auVar14);
            auVar103 = vblendvps_avx(ZEXT1632(auVar15),auVar103,auVar160);
            auVar97 = vsubps_avx(auVar97,auVar114);
            auVar21 = vsubps_avx(auVar21,auVar147);
            auVar115 = vsubps_avx(auVar103,auVar7);
            auVar116 = vsubps_avx(auVar114,auVar102);
            auVar20 = vsubps_avx(auVar147,auVar120);
            auVar201 = vsubps_avx(auVar7,auVar134);
            auVar155._0_4_ = auVar115._0_4_ * auVar114._0_4_;
            auVar155._4_4_ = auVar115._4_4_ * auVar114._4_4_;
            auVar155._8_4_ = auVar115._8_4_ * auVar114._8_4_;
            auVar155._12_4_ = auVar115._12_4_ * auVar114._12_4_;
            auVar155._16_4_ = auVar115._16_4_ * auVar114._16_4_;
            auVar155._20_4_ = auVar115._20_4_ * auVar114._20_4_;
            auVar155._24_4_ = auVar115._24_4_ * auVar114._24_4_;
            auVar155._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar155,auVar7,auVar97);
            auVar64._4_4_ = auVar97._4_4_ * auVar147._4_4_;
            auVar64._0_4_ = auVar97._0_4_ * auVar147._0_4_;
            auVar64._8_4_ = auVar97._8_4_ * auVar147._8_4_;
            auVar64._12_4_ = auVar97._12_4_ * auVar147._12_4_;
            auVar64._16_4_ = auVar97._16_4_ * auVar147._16_4_;
            auVar64._20_4_ = auVar97._20_4_ * auVar147._20_4_;
            auVar64._24_4_ = auVar97._24_4_ * auVar147._24_4_;
            auVar64._28_4_ = auVar103._28_4_;
            auVar16 = vfmsub231ps_fma(auVar64,auVar114,auVar21);
            auVar194 = ZEXT864(0) << 0x20;
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar156._0_4_ = auVar21._0_4_ * auVar7._0_4_;
            auVar156._4_4_ = auVar21._4_4_ * auVar7._4_4_;
            auVar156._8_4_ = auVar21._8_4_ * auVar7._8_4_;
            auVar156._12_4_ = auVar21._12_4_ * auVar7._12_4_;
            auVar156._16_4_ = auVar21._16_4_ * auVar7._16_4_;
            auVar156._20_4_ = auVar21._20_4_ * auVar7._20_4_;
            auVar156._24_4_ = auVar21._24_4_ * auVar7._24_4_;
            auVar156._28_4_ = 0;
            auVar16 = vfmsub231ps_fma(auVar156,auVar147,auVar115);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar157._0_4_ = auVar201._0_4_ * auVar102._0_4_;
            auVar157._4_4_ = auVar201._4_4_ * auVar102._4_4_;
            auVar157._8_4_ = auVar201._8_4_ * auVar102._8_4_;
            auVar157._12_4_ = auVar201._12_4_ * auVar102._12_4_;
            auVar157._16_4_ = auVar201._16_4_ * auVar102._16_4_;
            auVar157._20_4_ = auVar201._20_4_ * auVar102._20_4_;
            auVar157._24_4_ = auVar201._24_4_ * auVar102._24_4_;
            auVar157._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar157,auVar116,auVar134);
            auVar65._4_4_ = auVar20._4_4_ * auVar134._4_4_;
            auVar65._0_4_ = auVar20._0_4_ * auVar134._0_4_;
            auVar65._8_4_ = auVar20._8_4_ * auVar134._8_4_;
            auVar65._12_4_ = auVar20._12_4_ * auVar134._12_4_;
            auVar65._16_4_ = auVar20._16_4_ * auVar134._16_4_;
            auVar65._20_4_ = auVar20._20_4_ * auVar134._20_4_;
            auVar65._24_4_ = auVar20._24_4_ * auVar134._24_4_;
            auVar65._28_4_ = auVar134._28_4_;
            auVar95 = vfmsub231ps_fma(auVar65,auVar120,auVar201);
            auVar66._4_4_ = auVar116._4_4_ * auVar120._4_4_;
            auVar66._0_4_ = auVar116._0_4_ * auVar120._0_4_;
            auVar66._8_4_ = auVar116._8_4_ * auVar120._8_4_;
            auVar66._12_4_ = auVar116._12_4_ * auVar120._12_4_;
            auVar66._16_4_ = auVar116._16_4_ * auVar120._16_4_;
            auVar66._20_4_ = auVar116._20_4_ * auVar120._20_4_;
            auVar66._24_4_ = auVar116._24_4_ * auVar120._24_4_;
            auVar66._28_4_ = auVar120._28_4_;
            auVar94 = vfmsub231ps_fma(auVar66,auVar20,auVar102);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar95 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar95));
            auVar102 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar95));
            auVar102 = vcmpps_avx(auVar102,ZEXT832(0) << 0x20,2);
            auVar15 = vpackssdw_avx(auVar102._0_16_,auVar102._16_16_);
            auVar15 = vpand_avx(auVar15,auVar14);
            auVar102 = vpmovsxwd_avx2(auVar15);
            auVar158 = ZEXT3264(auVar102);
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar102 >> 0x7f,0) == '\0') &&
                  (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar102 >> 0xbf,0) == '\0') &&
                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar102[0x1f]) {
LAB_01599b0e:
              auVar141._8_8_ = uStack_458;
              auVar141._0_8_ = local_460;
              auVar141._16_8_ = uStack_450;
              auVar141._24_8_ = uStack_448;
              auVar186 = ZEXT3264(auVar98);
            }
            else {
              auVar67._4_4_ = auVar21._4_4_ * auVar201._4_4_;
              auVar67._0_4_ = auVar21._0_4_ * auVar201._0_4_;
              auVar67._8_4_ = auVar21._8_4_ * auVar201._8_4_;
              auVar67._12_4_ = auVar21._12_4_ * auVar201._12_4_;
              auVar67._16_4_ = auVar21._16_4_ * auVar201._16_4_;
              auVar67._20_4_ = auVar21._20_4_ * auVar201._20_4_;
              auVar67._24_4_ = auVar21._24_4_ * auVar201._24_4_;
              auVar67._28_4_ = auVar102._28_4_;
              auVar93 = vfmsub231ps_fma(auVar67,auVar20,auVar115);
              auVar163._0_4_ = auVar116._0_4_ * auVar115._0_4_;
              auVar163._4_4_ = auVar116._4_4_ * auVar115._4_4_;
              auVar163._8_4_ = auVar116._8_4_ * auVar115._8_4_;
              auVar163._12_4_ = auVar116._12_4_ * auVar115._12_4_;
              auVar163._16_4_ = auVar116._16_4_ * auVar115._16_4_;
              auVar163._20_4_ = auVar116._20_4_ * auVar115._20_4_;
              auVar163._24_4_ = auVar116._24_4_ * auVar115._24_4_;
              auVar163._28_4_ = 0;
              auVar112 = vfmsub231ps_fma(auVar163,auVar97,auVar201);
              auVar68._4_4_ = auVar97._4_4_ * auVar20._4_4_;
              auVar68._0_4_ = auVar97._0_4_ * auVar20._0_4_;
              auVar68._8_4_ = auVar97._8_4_ * auVar20._8_4_;
              auVar68._12_4_ = auVar97._12_4_ * auVar20._12_4_;
              auVar68._16_4_ = auVar97._16_4_ * auVar20._16_4_;
              auVar68._20_4_ = auVar97._20_4_ * auVar20._20_4_;
              auVar68._24_4_ = auVar97._24_4_ * auVar20._24_4_;
              auVar68._28_4_ = auVar20._28_4_;
              auVar113 = vfmsub231ps_fma(auVar68,auVar116,auVar21);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar113));
              auVar126 = vfmadd231ps_fma(ZEXT1632(auVar94),ZEXT1632(auVar93),ZEXT832(0) << 0x20);
              auVar102 = vrcpps_avx(ZEXT1632(auVar126));
              auVar193._8_4_ = 0x3f800000;
              auVar193._0_8_ = 0x3f8000003f800000;
              auVar193._12_4_ = 0x3f800000;
              auVar193._16_4_ = 0x3f800000;
              auVar193._20_4_ = 0x3f800000;
              auVar193._24_4_ = 0x3f800000;
              auVar193._28_4_ = 0x3f800000;
              auVar194 = ZEXT3264(auVar193);
              auVar94 = vfnmadd213ps_fma(auVar102,ZEXT1632(auVar126),auVar193);
              auVar94 = vfmadd132ps_fma(ZEXT1632(auVar94),auVar102,auVar102);
              auVar69._4_4_ = auVar113._4_4_ * auVar7._4_4_;
              auVar69._0_4_ = auVar113._0_4_ * auVar7._0_4_;
              auVar69._8_4_ = auVar113._8_4_ * auVar7._8_4_;
              auVar69._12_4_ = auVar113._12_4_ * auVar7._12_4_;
              auVar69._16_4_ = auVar7._16_4_ * 0.0;
              auVar69._20_4_ = auVar7._20_4_ * 0.0;
              auVar69._24_4_ = auVar7._24_4_ * 0.0;
              auVar69._28_4_ = auVar7._28_4_;
              auVar112 = vfmadd231ps_fma(auVar69,ZEXT1632(auVar112),auVar147);
              auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),ZEXT1632(auVar93),auVar114);
              fVar124 = auVar94._0_4_;
              fVar173 = auVar94._4_4_;
              fVar174 = auVar94._8_4_;
              fVar175 = auVar94._12_4_;
              auVar120 = ZEXT1632(CONCAT412(fVar175 * auVar112._12_4_,
                                            CONCAT48(fVar174 * auVar112._8_4_,
                                                     CONCAT44(fVar173 * auVar112._4_4_,
                                                              fVar124 * auVar112._0_4_))));
              auVar158 = ZEXT3264(auVar120);
              fVar110 = ray->tfar;
              auVar140._4_4_ = fVar110;
              auVar140._0_4_ = fVar110;
              auVar140._8_4_ = fVar110;
              auVar140._12_4_ = fVar110;
              auVar140._16_4_ = fVar110;
              auVar140._20_4_ = fVar110;
              auVar140._24_4_ = fVar110;
              auVar140._28_4_ = fVar110;
              auVar79._8_8_ = uStack_f8;
              auVar79._0_8_ = local_100;
              auVar79._16_8_ = uStack_f0;
              auVar79._24_8_ = uStack_e8;
              auVar7 = vcmpps_avx(auVar79,auVar120,2);
              auVar102 = vcmpps_avx(auVar120,auVar140,2);
              auVar7 = vandps_avx(auVar102,auVar7);
              auVar94 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
              auVar15 = vpand_avx(auVar15,auVar94);
              auVar7 = vpmovsxwd_avx2(auVar15);
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar7 >> 0x7f,0) == '\0') &&
                    (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar7 >> 0xbf,0) == '\0') &&
                  (auVar7 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar7[0x1f]) goto LAB_01599b0e;
              auVar7 = vcmpps_avx(ZEXT1632(auVar126),ZEXT832(0) << 0x20,4);
              auVar94 = vpackssdw_avx(auVar7._0_16_,auVar7._16_16_);
              auVar15 = vpand_avx(auVar15,auVar94);
              auVar7 = vpmovsxwd_avx2(auVar15);
              auVar141._8_8_ = uStack_458;
              auVar141._0_8_ = local_460;
              auVar141._16_8_ = uStack_450;
              auVar141._24_8_ = uStack_448;
              auVar186 = ZEXT3264(auVar98);
              if ((((((((auVar7 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar7 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar7 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar7 >> 0x7f,0) != '\0') ||
                    (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar7 >> 0xbf,0) != '\0') ||
                  (auVar7 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar7[0x1f] < '\0') {
                auVar134 = ZEXT1632(CONCAT412(fVar175 * auVar16._12_4_,
                                              CONCAT48(fVar174 * auVar16._8_4_,
                                                       CONCAT44(fVar173 * auVar16._4_4_,
                                                                fVar124 * auVar16._0_4_))));
                auVar70._28_4_ = SUB84(uStack_448,4);
                auVar70._0_28_ =
                     ZEXT1628(CONCAT412(fVar175 * auVar95._12_4_,
                                        CONCAT48(fVar174 * auVar95._8_4_,
                                                 CONCAT44(fVar173 * auVar95._4_4_,
                                                          fVar124 * auVar95._0_4_))));
                auVar171._8_4_ = 0x3f800000;
                auVar171._0_8_ = 0x3f8000003f800000;
                auVar171._12_4_ = 0x3f800000;
                auVar171._16_4_ = 0x3f800000;
                auVar171._20_4_ = 0x3f800000;
                auVar171._24_4_ = 0x3f800000;
                auVar171._28_4_ = 0x3f800000;
                auVar102 = vsubps_avx(auVar171,auVar134);
                local_6e0 = vblendvps_avx(auVar102,auVar134,auVar160);
                auVar102 = vsubps_avx(auVar171,auVar70);
                local_3a0 = vblendvps_avx(auVar102,auVar70,auVar160);
                auVar186 = ZEXT3264(auVar120);
                auVar141 = auVar7;
              }
            }
            auVar191 = ZEXT3264(local_680);
            auVar181 = ZEXT3264(local_6c0);
            auVar160 = local_5a0;
            if ((((((((auVar141 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar141 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar141 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar141 >> 0x7f,0) == '\0') &&
                  (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar141 >> 0xbf,0) == '\0') &&
                (auVar141 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar141[0x1f]) goto LAB_01599667;
            auVar7 = vsubps_avx(ZEXT1632(auVar13),auVar161);
            auVar13 = vfmadd213ps_fma(auVar7,local_6e0,auVar161);
            fVar110 = pre->depth_scale;
            auVar71._4_4_ = (auVar13._4_4_ + auVar13._4_4_) * fVar110;
            auVar71._0_4_ = (auVar13._0_4_ + auVar13._0_4_) * fVar110;
            auVar71._8_4_ = (auVar13._8_4_ + auVar13._8_4_) * fVar110;
            auVar71._12_4_ = (auVar13._12_4_ + auVar13._12_4_) * fVar110;
            auVar71._16_4_ = fVar110 * 0.0;
            auVar71._20_4_ = fVar110 * 0.0;
            auVar71._24_4_ = fVar110 * 0.0;
            auVar71._28_4_ = fVar110;
            local_200 = auVar186._0_32_;
            auVar7 = vcmpps_avx(local_200,auVar71,6);
            auVar102 = auVar141 & auVar7;
            auVar164 = ZEXT3264(local_5a0);
            auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                          CONCAT424(fStack_608,
                                                    CONCAT420(fStack_60c,
                                                              CONCAT416(fStack_610,
                                                                        CONCAT412(fStack_614,
                                                                                  CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
            auVar172 = ZEXT3264(local_640);
            if ((((((((auVar102 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar102 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar102 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar102 >> 0x7f,0) == '\0') &&
                  (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar102 >> 0xbf,0) == '\0') &&
                (auVar102 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar102[0x1f]) {
              auVar123 = ZEXT3264(local_6e0);
            }
            else {
              auVar122._8_4_ = 0xbf800000;
              auVar122._0_8_ = 0xbf800000bf800000;
              auVar122._12_4_ = 0xbf800000;
              auVar122._16_4_ = 0xbf800000;
              auVar122._20_4_ = 0xbf800000;
              auVar122._24_4_ = 0xbf800000;
              auVar122._28_4_ = 0xbf800000;
              auVar135._8_4_ = 0x40000000;
              auVar135._0_8_ = 0x4000000040000000;
              auVar135._12_4_ = 0x40000000;
              auVar135._16_4_ = 0x40000000;
              auVar135._20_4_ = 0x40000000;
              auVar135._24_4_ = 0x40000000;
              auVar135._28_4_ = 0x40000000;
              auVar13 = vfmadd213ps_fma(local_3a0,auVar135,auVar122);
              auVar158 = ZEXT1664(auVar13);
              local_240 = local_6e0;
              local_220 = ZEXT1632(auVar13);
              local_1dc = iVar9;
              local_1d0 = local_600;
              uStack_1c8 = uStack_5f8;
              local_1c0 = local_540._0_8_;
              uStack_1b8 = local_540._8_8_;
              local_1b0 = local_550._0_8_;
              uStack_1a8 = local_550._8_8_;
              local_700._0_8_ = (context->scene->geometries).items[local_648].ptr;
              auVar123 = ZEXT3264(local_6e0);
              local_3a0 = ZEXT1632(auVar13);
              auVar102 = local_3a0;
              if ((((Geometry *)local_700._0_8_)->mask & ray->mask) == 0) {
                bVar81 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar81 = 1,
                      ((Geometry *)local_700._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_700._8_24_ = auVar147._8_24_;
                local_720 = ZEXT1632(CONCAT88(auVar14._8_8_,context));
                auVar147 = vandps_avx(auVar7,auVar141);
                local_4c0 = ZEXT1632(CONCAT88(auVar12._8_8_,lVar87));
                fVar125 = (float)local_1e0;
                local_160[0] = (fVar125 + local_6e0._0_4_ + 0.0) * (float)local_420;
                local_160[1] = (fVar125 + local_6e0._4_4_ + 1.0) * local_420._4_4_;
                local_160[2] = (fVar125 + local_6e0._8_4_ + 2.0) * (float)uStack_418;
                local_160[3] = (fVar125 + local_6e0._12_4_ + 3.0) * uStack_418._4_4_;
                fStack_150 = (fVar125 + local_6e0._16_4_ + 4.0) * fStack_410;
                fStack_14c = (fVar125 + local_6e0._20_4_ + 5.0) * fStack_40c;
                fStack_148 = (fVar125 + local_6e0._24_4_ + 6.0) * fStack_408;
                fStack_144 = fVar125 + local_6e0._28_4_ + 7.0;
                local_3a0._0_8_ = auVar13._0_8_;
                local_3a0._8_8_ = auVar13._8_8_;
                local_140 = local_3a0._0_8_;
                uStack_138 = local_3a0._8_8_;
                uStack_130 = 0;
                uStack_128 = 0;
                local_6a0 = local_200;
                local_120 = local_200;
                uVar84 = vmovmskps_avx(auVar147);
                local_3a0 = auVar102;
                if (uVar84 == 0) {
                  bVar81 = 0;
LAB_01599b43:
                  auVar123 = ZEXT3264(local_6e0);
                  auVar181 = ZEXT3264(local_6c0);
                  auVar186 = ZEXT3264(local_6a0);
                  auVar191 = ZEXT3264(local_680);
                  auVar164 = ZEXT3264(local_5a0);
                  auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                                CONCAT424(fStack_608,
                                                          CONCAT420(fStack_60c,
                                                                    CONCAT416(fStack_610,
                                                                              CONCAT412(fStack_614,
                                                                                        CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                  auVar172 = ZEXT3264(local_640);
                  context = (RayQueryContext *)local_720._0_8_;
                  lVar87 = local_4c0._0_8_;
                  pre = local_788;
                  fVar125 = (float)local_580;
                  fVar104 = local_580._4_4_;
                  fVar105 = (float)uStack_578;
                  fVar106 = uStack_578._4_4_;
                  fVar107 = (float)uStack_570;
                  fVar108 = uStack_570._4_4_;
                  fVar109 = (float)uStack_568;
                }
                else {
                  uVar82 = CONCAT44(0,uVar84 & 0xff);
                  auStack_738 = auVar114._8_24_;
                  local_740 = uVar82;
                  lVar87 = 0;
                  for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                    lVar87 = lVar87 + 1;
                  }
                  _local_780 = ZEXT1632(CONCAT88(auVar17._8_8_,lVar87));
                  stack0xfffffffffffffb04 = auVar18._4_28_;
                  local_500._0_4_ = ray->tfar;
                  pGVar86 = (Geometry *)local_700._0_8_;
                  _local_2e0 = auVar19;
                  do {
                    local_524 = local_160[(long)local_780];
                    local_520 = *(undefined4 *)((long)&local_140 + (long)local_780 * 4);
                    ray->tfar = *(float *)(local_120 + (long)local_780 * 4);
                    local_5f0.context = context->user;
                    fVar104 = 1.0 - local_524;
                    fVar125 = fVar104 * fVar104 * -3.0;
                    auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * fVar104)),
                                              ZEXT416((uint)(local_524 * fVar104)),
                                              ZEXT416(0xc0000000));
                    auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_524 * fVar104)),
                                              ZEXT416((uint)(local_524 * local_524)),
                                              ZEXT416(0x40000000));
                    fVar104 = auVar17._0_4_ * 3.0;
                    fVar105 = auVar12._0_4_ * 3.0;
                    fVar106 = local_524 * local_524 * 3.0;
                    auVar154._0_4_ = fVar106 * (float)local_470._0_4_;
                    auVar154._4_4_ = fVar106 * (float)local_470._4_4_;
                    auVar154._8_4_ = fVar106 * fStack_468;
                    auVar154._12_4_ = fVar106 * fStack_464;
                    auVar158 = ZEXT1664(auVar154);
                    auVar130._4_4_ = fVar105;
                    auVar130._0_4_ = fVar105;
                    auVar130._8_4_ = fVar105;
                    auVar130._12_4_ = fVar105;
                    auVar17 = vfmadd132ps_fma(auVar130,auVar154,local_550);
                    auVar139._4_4_ = fVar104;
                    auVar139._0_4_ = fVar104;
                    auVar139._8_4_ = fVar104;
                    auVar139._12_4_ = fVar104;
                    auVar17 = vfmadd132ps_fma(auVar139,auVar17,local_540);
                    auVar131._4_4_ = fVar125;
                    auVar131._0_4_ = fVar125;
                    auVar131._8_4_ = fVar125;
                    auVar131._12_4_ = fVar125;
                    auVar78._8_8_ = uStack_5f8;
                    auVar78._0_8_ = local_600;
                    auVar17 = vfmadd132ps_fma(auVar131,auVar17,auVar78);
                    local_530 = vmovlps_avx(auVar17);
                    local_528 = vextractps_avx(auVar17,2);
                    local_51c = local_744;
                    local_518 = (int)local_648;
                    local_514 = (local_5f0.context)->instID[0];
                    local_510 = (local_5f0.context)->instPrimID[0];
                    local_794 = -1;
                    local_5f0.valid = &local_794;
                    local_5f0.geometryUserPtr = pGVar86->userPtr;
                    local_5f0.ray = (RTCRayN *)ray;
                    local_5f0.hit = (RTCHitN *)&local_530;
                    local_5f0.N = 1;
                    if (pGVar86->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015999fb:
                      pcVar11 = *(code **)(*(byte **)(local_720._0_8_ + 0x10) + 0x10);
                      if ((pcVar11 != (code *)0x0) &&
                         (((**(byte **)(local_720._0_8_ + 0x10) & 2) != 0 ||
                          ((*(byte *)(local_700._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar158 = ZEXT1664(auVar158._0_16_);
                        auVar194 = ZEXT1664(auVar194._0_16_);
                        (*pcVar11)(&local_5f0);
                        if (*local_5f0.valid == 0) goto LAB_01599a49;
                      }
                      bVar81 = 1;
                      goto LAB_01599b43;
                    }
                    auVar158 = ZEXT1664(auVar154);
                    auVar194 = ZEXT1664(auVar194._0_16_);
                    (*pGVar86->occlusionFilterN)(&local_5f0);
                    if (*local_5f0.valid != 0) goto LAB_015999fb;
LAB_01599a49:
                    ray->tfar = (float)local_500._0_4_;
                    uVar83 = local_740 ^ 1L << ((ulong)local_780 & 0x3f);
                    bVar81 = 0;
                    local_740 = uVar83;
                    lVar87 = 0;
                    for (uVar82 = uVar83; (uVar82 & 1) == 0;
                        uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                      lVar87 = lVar87 + 1;
                    }
                    local_780 = (undefined1  [8])lVar87;
                    auVar123 = ZEXT3264(local_6e0);
                    auVar181 = ZEXT3264(local_6c0);
                    auVar186 = ZEXT3264(local_6a0);
                    auVar191 = ZEXT3264(local_680);
                    auVar164 = ZEXT3264(local_5a0);
                    auVar167 = ZEXT3264(CONCAT428(fStack_604,
                                                  CONCAT424(fStack_608,
                                                            CONCAT420(fStack_60c,
                                                                      CONCAT416(fStack_610,
                                                                                CONCAT412(fStack_614
                                                                                          ,CONCAT48(
                                                  fStack_618,CONCAT44(fStack_61c,local_620))))))));
                    auVar172 = ZEXT3264(local_640);
                    context = (RayQueryContext *)local_720._0_8_;
                    pGVar86 = (Geometry *)local_700._0_8_;
                    lVar87 = local_4c0._0_8_;
                    pre = local_788;
                    fVar125 = (float)local_580;
                    fVar104 = local_580._4_4_;
                    fVar105 = (float)uStack_578;
                    fVar106 = uStack_578._4_4_;
                    fVar107 = (float)uStack_570;
                    fVar108 = uStack_570._4_4_;
                    fVar109 = (float)uStack_568;
                  } while (uVar83 != 0);
                }
              }
              bVar88 = (bool)(bVar88 | bVar81);
            }
          }
          local_6e0 = auVar123._0_32_;
          lVar87 = lVar87 + 8;
          auVar142 = ZEXT3264(local_5c0);
          auVar203 = ZEXT3264(local_4e0);
        } while ((int)lVar87 < iVar9);
      }
      if (bVar88) {
        return bVar88;
      }
      fVar125 = ray->tfar;
      auVar96._4_4_ = fVar125;
      auVar96._0_4_ = fVar125;
      auVar96._8_4_ = fVar125;
      auVar96._12_4_ = fVar125;
      auVar17 = vcmpps_avx(local_260,auVar96,2);
      uVar84 = vmovmskps_avx(auVar17);
      uVar84 = (uint)uVar89 & uVar84;
    } while (uVar84 != 0);
  }
  return bVar88;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }